

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 454.test.cpp
# Opt level: O3

void verifyChunkWithEnergyIndependentYields(Type<8,_454> *chunk)

{
  int iVar1;
  _Alloc_hider _Var2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  double *pdVar6;
  FissionYieldData *entry;
  pointer pFVar7;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef macroName_03;
  StringRef macroName_04;
  StringRef macroName_05;
  StringRef macroName_06;
  StringRef macroName_07;
  StringRef macroName_08;
  StringRef macroName_09;
  StringRef macroName_10;
  StringRef macroName_11;
  StringRef macroName_12;
  StringRef macroName_13;
  StringRef macroName_14;
  StringRef macroName_15;
  StringRef macroName_16;
  StringRef macroName_17;
  StringRef macroName_18;
  StringRef macroName_19;
  StringRef macroName_20;
  StringRef macroName_21;
  StringRef macroName_22;
  StringRef macroName_23;
  StringRef macroName_24;
  StringRef macroName_25;
  StringRef macroName_26;
  StringRef macroName_27;
  StringRef macroName_28;
  StringRef macroName_29;
  StringRef macroName_30;
  StringRef macroName_31;
  StringRef macroName_32;
  StringRef macroName_33;
  StringRef macroName_34;
  StringRef macroName_35;
  StringRef macroName_36;
  StringRef macroName_37;
  StringRef macroName_38;
  StringRef macroName_39;
  StringRef macroName_40;
  StringRef macroName_41;
  StringRef macroName_42;
  StringRef macroName_43;
  StringRef macroName_44;
  StringRef macroName_45;
  StringRef macroName_46;
  StringRef macroName_47;
  StringRef macroName_48;
  StringRef macroName_49;
  StringRef macroName_50;
  StringRef macroName_51;
  StringRef macroName_52;
  StringRef macroName_53;
  StringRef macroName_54;
  StringRef macroName_55;
  StringRef macroName_56;
  StringRef macroName_57;
  StringRef macroName_58;
  StringRef macroName_59;
  StringRef macroName_60;
  StringRef macroName_61;
  StringRef macroName_62;
  StringRef macroName_63;
  StringRef macroName_64;
  StringRef macroName_65;
  StringRef macroName_66;
  StringRef macroName_67;
  StringRef macroName_68;
  StringRef macroName_69;
  StringRef macroName_70;
  StringRef macroName_71;
  StringRef macroName_72;
  StringRef macroName_73;
  StringRef macroName_74;
  StringRef macroName_75;
  StringRef macroName_76;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  StringRef capturedExpression_03;
  StringRef capturedExpression_04;
  StringRef capturedExpression_05;
  StringRef capturedExpression_06;
  StringRef capturedExpression_07;
  StringRef capturedExpression_08;
  StringRef capturedExpression_09;
  StringRef capturedExpression_10;
  StringRef capturedExpression_11;
  StringRef capturedExpression_12;
  StringRef capturedExpression_13;
  StringRef capturedExpression_14;
  StringRef capturedExpression_15;
  StringRef capturedExpression_16;
  StringRef capturedExpression_17;
  StringRef capturedExpression_18;
  StringRef capturedExpression_19;
  StringRef capturedExpression_20;
  StringRef capturedExpression_21;
  StringRef capturedExpression_22;
  StringRef capturedExpression_23;
  StringRef capturedExpression_24;
  StringRef capturedExpression_25;
  StringRef capturedExpression_26;
  StringRef capturedExpression_27;
  StringRef capturedExpression_28;
  StringRef capturedExpression_29;
  StringRef capturedExpression_30;
  StringRef capturedExpression_31;
  StringRef capturedExpression_32;
  StringRef capturedExpression_33;
  StringRef capturedExpression_34;
  StringRef capturedExpression_35;
  StringRef capturedExpression_36;
  StringRef capturedExpression_37;
  StringRef capturedExpression_38;
  StringRef capturedExpression_39;
  StringRef capturedExpression_40;
  StringRef capturedExpression_41;
  StringRef capturedExpression_42;
  StringRef capturedExpression_43;
  StringRef capturedExpression_44;
  StringRef capturedExpression_45;
  StringRef capturedExpression_46;
  StringRef capturedExpression_47;
  StringRef capturedExpression_48;
  StringRef capturedExpression_49;
  StringRef capturedExpression_50;
  StringRef capturedExpression_51;
  StringRef capturedExpression_52;
  StringRef capturedExpression_53;
  StringRef capturedExpression_54;
  StringRef capturedExpression_55;
  StringRef capturedExpression_56;
  StringRef capturedExpression_57;
  StringRef capturedExpression_58;
  StringRef capturedExpression_59;
  StringRef capturedExpression_60;
  StringRef capturedExpression_61;
  StringRef capturedExpression_62;
  StringRef capturedExpression_63;
  StringRef capturedExpression_64;
  StringRef capturedExpression_65;
  StringRef capturedExpression_66;
  StringRef capturedExpression_67;
  StringRef capturedExpression_68;
  StringRef capturedExpression_69;
  StringRef capturedExpression_70;
  StringRef capturedExpression_71;
  StringRef capturedExpression_72;
  StringRef capturedExpression_73;
  StringRef capturedExpression_74;
  StringRef capturedExpression_75;
  StringRef capturedExpression_76;
  AssertionHandler catchAssertionHandler_14;
  FissionYieldData data;
  undefined1 local_3d8 [8];
  undefined8 local_3d0;
  char *local_3c8;
  undefined1 local_3c0 [8];
  int local_3b8;
  undefined4 uStack_3b4;
  bool local_39d;
  IResultCapture *local_398;
  undefined1 local_390 [8];
  undefined8 local_388;
  ITransientExpression *local_380;
  undefined1 local_378 [8];
  int local_370;
  undefined4 uStack_36c;
  double local_368;
  double local_360;
  undefined1 local_358 [48];
  undefined1 local_328 [16];
  IResultCapture *local_318;
  ITransientExpression local_308;
  double *local_2f8;
  WithinRelMatcher *local_2f0;
  ulong local_2e8;
  undefined8 local_2e0;
  long local_2d8;
  Type<8,_454> *local_2d0;
  undefined1 local_2c8 [8];
  undefined8 local_2c0;
  ITransientExpression *local_2b8;
  sentinel_t<CRng> local_2b0;
  ITransientExpression *local_2a8;
  int local_29c;
  iterator_t<CRng>_conflict3 local_298;
  ITransientExpression *local_278;
  ITransientExpression local_270;
  int *local_260;
  WithinRelMatcher *local_258;
  iterator_t<CRng>_conflict1 local_250;
  ITransientExpression *local_248;
  iterator_t<CRng>_conflict1 local_240;
  ITransientExpression *local_238;
  iterator_t<CRng>_conflict1 local_230;
  ITransientExpression *local_228;
  iterator_t<CRng>_conflict1 local_220;
  ITransientExpression *local_218;
  iterator_t<CRng>_conflict1 local_210;
  ITransientExpression *local_208;
  iterator_t<CRng>_conflict1 local_200;
  ITransientExpression *local_1f8;
  iterator_t<CRng>_conflict1 local_1f0;
  ITransientExpression *local_1e8;
  iterator_t<CRng>_conflict1 local_1e0;
  ITransientExpression *local_1d8;
  double local_1d0;
  double local_1c8;
  iterator_t<CRng>_conflict3 local_1c0;
  SourceLineInfo *local_1a0;
  iterator_t<CRng>_conflict3 local_198;
  SourceLineInfo *local_178;
  iterator_t<CRng>_conflict3 local_170;
  SourceLineInfo *local_150;
  iterator_t<CRng>_conflict3 local_148;
  SourceLineInfo *local_128;
  iterator_t<CRng>_conflict3 local_120;
  ITransientExpression *local_100;
  iterator_t<CRng>_conflict3 local_f8;
  ITransientExpression *local_d8;
  iterator_t<CRng>_conflict3 local_d0;
  ITransientExpression *local_b0;
  iterator_t<CRng>_conflict3 local_a8;
  ITransientExpression *local_88;
  iterator_t<CRng>_conflict3 local_80;
  ITransientExpression *local_60;
  iterator_t<CRng>_conflict3 local_58;
  ITransientExpression *local_38;
  
  local_3d8 = (undefined1  [8])0x1a94b4;
  local_3d0 = (pointer)0x1fd;
  macroName.m_size = 5;
  macroName.m_start = "CHECK";
  capturedExpression.m_size = 0x11;
  capturedExpression.m_start = "454 == chunk.MT()";
  local_2d0 = chunk;
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_358,macroName,(SourceLineInfo *)local_3d8,capturedExpression,
             ContinueOnFailure);
  local_3d0._0_2_ = 0x101;
  local_3d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001eb220;
  local_3d0._4_4_ = 0x1c6;
  local_3c8 = "==";
  local_3c0 = (undefined1  [8])0x2;
  local_3b8 = 0x1c6;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_358,(ITransientExpression *)local_3d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_3d8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_358);
  if (local_328[0xb] == false) {
    (*local_318->_vptr_IResultCapture[0x13])();
  }
  local_3d8 = (undefined1  [8])0x1a94b4;
  local_3d0 = (pointer)0x1fe;
  macroName_00.m_size = 5;
  macroName_00.m_start = "CHECK";
  capturedExpression_00.m_size = 0x1c;
  capturedExpression_00.m_start = "454 == chunk.sectionNumber()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_358,macroName_00,(SourceLineInfo *)local_3d8,
             capturedExpression_00,ContinueOnFailure);
  local_3d0._0_2_ = 0x101;
  local_3d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001eb220;
  local_3d0._4_4_ = 0x1c6;
  local_3c8 = "==";
  local_3c0 = (undefined1  [8])0x2;
  local_3b8 = 0x1c6;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_358,(ITransientExpression *)local_3d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_3d8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_358);
  if (local_328[0xb] == false) {
    (*local_318->_vptr_IResultCapture[0x13])();
  }
  local_3d8 = (undefined1  [8])0x1a94b4;
  local_3d0 = (pointer)0x200;
  macroName_01.m_size = 5;
  macroName_01.m_start = "CHECK";
  capturedExpression_01.m_size = 0x13;
  capturedExpression_01.m_start = "92235 == chunk.ZA()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_358,macroName_01,(SourceLineInfo *)local_3d8,
             capturedExpression_01,ContinueOnFailure);
  iVar1 = (local_2d0->super_BaseWithoutMT<njoy::ENDFtk::section::Type<8,_454>_>).ZA_;
  local_3d0._1_1_ = iVar1 == 0x1684b;
  local_3d0._0_1_ = true;
  local_3d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001eb220;
  local_3d0._4_4_ = 0x1684b;
  local_3c8 = "==";
  local_3c0 = (undefined1  [8])0x2;
  local_3b8 = iVar1;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_358,(ITransientExpression *)local_3d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_3d8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_358);
  if (local_328[0xb] == false) {
    (*local_318->_vptr_IResultCapture[0x13])();
  }
  local_3d8 = (undefined1  [8])0x1a94b4;
  local_3d0 = (pointer)0x201;
  macroName_02.m_size = 5;
  macroName_02.m_start = "CHECK";
  capturedExpression_02.m_size = 0x21;
  capturedExpression_02.m_start = "92235 == chunk.targetIdentifier()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_358,macroName_02,(SourceLineInfo *)local_3d8,
             capturedExpression_02,ContinueOnFailure);
  iVar1 = (local_2d0->super_BaseWithoutMT<njoy::ENDFtk::section::Type<8,_454>_>).ZA_;
  local_3d0._1_1_ = iVar1 == 0x1684b;
  local_3d0._0_1_ = true;
  local_3d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001eb220;
  local_3d0._4_4_ = 0x1684b;
  local_3c8 = "==";
  local_3c0 = (undefined1  [8])0x2;
  local_3b8 = iVar1;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_358,(ITransientExpression *)local_3d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_3d8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_358);
  if (local_328[0xb] == false) {
    (*local_318->_vptr_IResultCapture[0x13])();
  }
  local_3d8 = (undefined1  [8])0x1a94b4;
  local_3d0 = (pointer)0x202;
  macroName_03.m_size = 10;
  macroName_03.m_start = "CHECK_THAT";
  capturedExpression_03.m_size = 0x22;
  capturedExpression_03.m_start = "233.0250, WithinRel( chunk.AWR() )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_358,macroName_03,(SourceLineInfo *)local_3d8,
             capturedExpression_03,ContinueOnFailure);
  local_308._vptr_ITransientExpression = (_func_int **)0x406d20cccccccccd;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_3d8,
             (local_2d0->super_BaseWithoutMT<njoy::ENDFtk::section::Type<8,_454>_>).
             atomicWeightRatio_);
  bVar3 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_3d8,(double *)&local_308);
  local_388._1_1_ = bVar3;
  local_388._0_1_ = true;
  local_390 = (undefined1  [8])&PTR_streamReconstructedExpression_001eb260;
  local_380 = &local_308;
  local_378 = (undefined1  [8])local_3d8;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_358,(ITransientExpression *)local_390);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_390);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_3d8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_358);
  if (local_328[0xb] == false) {
    (*local_318->_vptr_IResultCapture[0x13])();
  }
  local_3d8 = (undefined1  [8])0x1a94b4;
  local_3d0 = (pointer)0x203;
  macroName_04.m_size = 10;
  macroName_04.m_start = "CHECK_THAT";
  capturedExpression_04.m_size = 0x30;
  capturedExpression_04.m_start = "233.0250, WithinRel( chunk.atomicWeightRatio() )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_358,macroName_04,(SourceLineInfo *)local_3d8,
             capturedExpression_04,ContinueOnFailure);
  local_308._vptr_ITransientExpression = (_func_int **)0x406d20cccccccccd;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_3d8,
             (local_2d0->super_BaseWithoutMT<njoy::ENDFtk::section::Type<8,_454>_>).
             atomicWeightRatio_);
  bVar3 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_3d8,(double *)&local_308);
  local_388._1_1_ = bVar3;
  local_388._0_1_ = true;
  local_390 = (undefined1  [8])&PTR_streamReconstructedExpression_001eb260;
  local_380 = &local_308;
  local_378 = (undefined1  [8])local_3d8;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_358,(ITransientExpression *)local_390);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_390);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_3d8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_358);
  if (local_328[0xb] == false) {
    (*local_318->_vptr_IResultCapture[0x13])();
  }
  local_3d8 = (undefined1  [8])0x1a94b4;
  local_3d0 = (pointer)0x205;
  macroName_05.m_size = 5;
  macroName_05.m_start = "CHECK";
  capturedExpression_05.m_size = 0x12;
  capturedExpression_05.m_start = "true == chunk.LE()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_358,macroName_05,(SourceLineInfo *)local_3d8,
             capturedExpression_05,ContinueOnFailure);
  _Var2._M_p = local_3d0;
  local_3d0._1_1_ =
       (long)(local_2d0->data_).
             super__Vector_base<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(local_2d0->data_).
             super__Vector_base<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
             ._M_impl.super__Vector_impl_data._M_start == 0x48;
  local_3d0._0_1_ = true;
  local_3d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001eb2a0;
  local_3d0._3_5_ = SUB85(_Var2._M_p,3);
  local_3d0._2_1_ = 1;
  local_3c8 = "==";
  local_3c0 = (undefined1  [8])0x2;
  local_3b8._0_1_ = local_3d0._1_1_;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_358,(ITransientExpression *)local_3d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_3d8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_358);
  if (local_328[0xb] == false) {
    (*local_318->_vptr_IResultCapture[0x13])();
  }
  local_3d8 = (undefined1  [8])0x1a94b4;
  local_3d0 = (pointer)0x206;
  macroName_06.m_size = 5;
  macroName_06.m_start = "CHECK";
  capturedExpression_06.m_size = 0x23;
  capturedExpression_06.m_start = "true == chunk.isEnergyIndependent()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_358,macroName_06,(SourceLineInfo *)local_3d8,
             capturedExpression_06,ContinueOnFailure);
  _Var2._M_p = local_3d0;
  local_3d0._1_1_ =
       (long)(local_2d0->data_).
             super__Vector_base<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(local_2d0->data_).
             super__Vector_base<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
             ._M_impl.super__Vector_impl_data._M_start == 0x48;
  local_3d0._0_1_ = true;
  local_3d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001eb2a0;
  local_3d0._3_5_ = SUB85(_Var2._M_p,3);
  local_3d0._2_1_ = 1;
  local_3c8 = "==";
  local_3c0 = (undefined1  [8])0x2;
  local_3b8._0_1_ = local_3d0._1_1_;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_358,(ITransientExpression *)local_3d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_3d8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_358);
  if (local_328[0xb] == false) {
    (*local_318->_vptr_IResultCapture[0x13])();
  }
  local_3d8 = (undefined1  [8])0x1a94b4;
  local_3d0 = (pointer)0x208;
  macroName_07.m_size = 5;
  macroName_07.m_start = "CHECK";
  capturedExpression_07.m_size = 0xf;
  capturedExpression_07.m_start = "1 == chunk.NE()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_358,macroName_07,(SourceLineInfo *)local_3d8,
             capturedExpression_07,ContinueOnFailure);
  lVar4 = (long)(local_2d0->data_).
                super__Vector_base<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(local_2d0->data_).
                super__Vector_base<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
                ._M_impl.super__Vector_impl_data._M_start;
  _local_3b8 = (lVar4 >> 3) * -0x71c71c71c71c71c7;
  local_3d0._1_1_ = lVar4 == 0x48;
  local_3d0._0_1_ = true;
  local_3d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001eb2e0;
  local_3d0._4_4_ = 1;
  local_3c8 = "==";
  local_3c0 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_358,(ITransientExpression *)local_3d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_3d8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_358);
  if (local_328[0xb] == false) {
    (*local_318->_vptr_IResultCapture[0x13])();
  }
  local_3d8 = (undefined1  [8])0x1a94b4;
  local_3d0 = (pointer)0x209;
  macroName_08.m_size = 5;
  macroName_08.m_start = "CHECK";
  capturedExpression_08.m_size = 0x15;
  capturedExpression_08.m_start = "1 == chunk.E().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_358,macroName_08,(SourceLineInfo *)local_3d8,
             capturedExpression_08,ContinueOnFailure);
  lVar4 = (long)(local_2d0->data_).
                super__Vector_base<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(local_2d0->data_).
                super__Vector_base<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
                ._M_impl.super__Vector_impl_data._M_start;
  _local_3b8 = (lVar4 >> 3) * -0x71c71c71c71c71c7;
  local_3d0._1_1_ = lVar4 == 0x48;
  local_3d0._0_1_ = true;
  local_3d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001eb320;
  local_3d0._4_4_ = 1;
  local_3c8 = "==";
  local_3c0 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_358,(ITransientExpression *)local_3d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_3d8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_358);
  if (local_328[0xb] == false) {
    (*local_318->_vptr_IResultCapture[0x13])();
  }
  local_3d8 = (undefined1  [8])0x1a94b4;
  local_3d0 = (pointer)0x20a;
  macroName_09.m_size = 5;
  macroName_09.m_start = "CHECK";
  capturedExpression_09.m_size = 0x24;
  capturedExpression_09.m_start = "1 == chunk.incidentEnergies().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_358,macroName_09,(SourceLineInfo *)local_3d8,
             capturedExpression_09,ContinueOnFailure);
  lVar4 = (long)(local_2d0->data_).
                super__Vector_base<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(local_2d0->data_).
                super__Vector_base<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
                ._M_impl.super__Vector_impl_data._M_start;
  _local_3b8 = (lVar4 >> 3) * -0x71c71c71c71c71c7;
  local_3d0._1_1_ = lVar4 == 0x48;
  local_3d0._0_1_ = true;
  local_3d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001eb320;
  local_3d0._4_4_ = 1;
  local_3c8 = "==";
  local_3c0 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_358,(ITransientExpression *)local_3d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_3d8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_358);
  if (local_328[0xb] == false) {
    (*local_318->_vptr_IResultCapture[0x13])();
  }
  local_3d8 = (undefined1  [8])0x1a94b4;
  local_3d0 = (pointer)0x20b;
  macroName_10.m_size = 10;
  macroName_10.m_start = "CHECK_THAT";
  capturedExpression_10.m_size = 0x1d;
  capturedExpression_10.m_start = "0., WithinRel( chunk.E()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_358,macroName_10,(SourceLineInfo *)local_3d8,
             capturedExpression_10,ContinueOnFailure);
  local_308._vptr_ITransientExpression = (_func_int **)0x0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_3d8,
             (((local_2d0->data_).
               super__Vector_base<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
               ._M_impl.super__Vector_impl_data._M_start)->super_ListRecord).metadata.fields.
             super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Head_base<0UL,_double,_false>._M_head_impl);
  bVar3 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_3d8,(double *)&local_308);
  local_388._1_1_ = bVar3;
  local_388._0_1_ = true;
  local_390 = (undefined1  [8])&PTR_streamReconstructedExpression_001eb260;
  local_380 = &local_308;
  local_378 = (undefined1  [8])local_3d8;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_358,(ITransientExpression *)local_390);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_390);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_3d8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_358);
  if (local_328[0xb] == false) {
    (*local_318->_vptr_IResultCapture[0x13])();
  }
  local_3d8 = (undefined1  [8])0x1a94b4;
  local_3d0 = (pointer)0x20c;
  macroName_11.m_size = 10;
  macroName_11.m_start = "CHECK_THAT";
  capturedExpression_11.m_size = 0x2c;
  capturedExpression_11.m_start = "0., WithinRel( chunk.incidentEnergies()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_358,macroName_11,(SourceLineInfo *)local_3d8,
             capturedExpression_11,ContinueOnFailure);
  local_308._vptr_ITransientExpression = (_func_int **)0x0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_3d8,
             (((local_2d0->data_).
               super__Vector_base<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
               ._M_impl.super__Vector_impl_data._M_start)->super_ListRecord).metadata.fields.
             super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Head_base<0UL,_double,_false>._M_head_impl);
  bVar3 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_3d8,(double *)&local_308);
  local_388._1_1_ = bVar3;
  local_388._0_1_ = true;
  local_390 = (undefined1  [8])&PTR_streamReconstructedExpression_001eb260;
  local_380 = &local_308;
  local_378 = (undefined1  [8])local_3d8;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_358,(ITransientExpression *)local_390);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_390);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_3d8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_358);
  if (local_328[0xb] == false) {
    (*local_318->_vptr_IResultCapture[0x13])();
  }
  local_3d8 = (undefined1  [8])0x1a94b4;
  local_3d0 = (pointer)0x20e;
  macroName_12.m_size = 5;
  macroName_12.m_start = "CHECK";
  capturedExpression_12.m_size = 0x1a;
  capturedExpression_12.m_start = "1 == chunk.yields().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_358,macroName_12,(SourceLineInfo *)local_3d8,
             capturedExpression_12,ContinueOnFailure);
  lVar4 = (long)(local_2d0->data_).
                super__Vector_base<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(local_2d0->data_).
                super__Vector_base<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
                ._M_impl.super__Vector_impl_data._M_start;
  _local_3b8 = (lVar4 >> 3) * -0x71c71c71c71c71c7;
  local_3d0._1_1_ = lVar4 == 0x48;
  local_3d0._0_1_ = true;
  local_3d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001eb320;
  local_3d0._4_4_ = 1;
  local_3c8 = "==";
  local_3c0 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_358,(ITransientExpression *)local_3d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_3d8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_358);
  if (local_328[0xb] == false) {
    (*local_318->_vptr_IResultCapture[0x13])();
  }
  pFVar7 = (local_2d0->data_).
           super__Vector_base<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_358._0_8_ = *(undefined8 *)&(pFVar7->super_ListRecord).metadata.fields;
  local_358._8_8_ =
       (pFVar7->super_ListRecord).metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl;
  local_358._16_8_ =
       (pFVar7->super_ListRecord).metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Head_base<3UL,_long,_false>._M_head_impl;
  local_358._24_8_ =
       (pFVar7->super_ListRecord).metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
       _M_head_impl;
  local_358._32_8_ =
       (pFVar7->super_ListRecord).metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
       _M_head_impl;
  local_358._40_8_ =
       (pFVar7->super_ListRecord).metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Head_base<0UL,_double,_false>._M_head_impl;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_328,&(pFVar7->super_ListRecord).data);
  local_390 = (undefined1  [8])0x1a94b4;
  local_388 = (pointer)0x211;
  macroName_13.m_size = 5;
  macroName_13.m_start = "CHECK";
  capturedExpression_13.m_size = 0xd;
  capturedExpression_13.m_start = "0 == data.I()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_3d8,macroName_13,(SourceLineInfo *)local_390,
             capturedExpression_13,ContinueOnFailure);
  local_388._1_1_ = local_358._24_4_ == 0;
  local_388._0_1_ = true;
  local_390 = (undefined1  [8])&PTR_streamReconstructedExpression_001eb220;
  local_388 = local_388 & 0xffffffff;
  local_380 = (ITransientExpression *)0x1ab5ad;
  local_378 = (undefined1  [8])0x2;
  local_370 = local_358._24_4_;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_3d8,(ITransientExpression *)local_390);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_390);
  Catch::AssertionHandler::complete((AssertionHandler *)local_3d8);
  if (local_39d == false) {
    (*local_398->_vptr_IResultCapture[0x13])();
  }
  local_390 = (undefined1  [8])0x1a94b4;
  local_388 = (pointer)0x212;
  macroName_14.m_size = 5;
  macroName_14.m_start = "CHECK";
  capturedExpression_14.m_size = 0x1d;
  capturedExpression_14.m_start = "0 == data.interpolationType()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_3d8,macroName_14,(SourceLineInfo *)local_390,
             capturedExpression_14,ContinueOnFailure);
  local_388._1_1_ = local_358._24_4_ == 0;
  local_388._0_1_ = true;
  local_390 = (undefined1  [8])&PTR_streamReconstructedExpression_001eb220;
  local_388 = local_388 & 0xffffffff;
  local_380 = (ITransientExpression *)0x1ab5ad;
  local_378 = (undefined1  [8])0x2;
  local_370 = local_358._24_4_;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_3d8,(ITransientExpression *)local_390);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_390);
  Catch::AssertionHandler::complete((AssertionHandler *)local_3d8);
  if (local_39d == false) {
    (*local_398->_vptr_IResultCapture[0x13])();
  }
  local_390 = (undefined1  [8])0x1a94b4;
  local_388 = (pointer)0x213;
  macroName_15.m_size = 5;
  macroName_15.m_start = "CHECK";
  capturedExpression_15.m_size = 0x11;
  capturedExpression_15.m_start = "true == data.LE()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_3d8,macroName_15,(SourceLineInfo *)local_390,
             capturedExpression_15,ContinueOnFailure);
  _Var2._M_p = local_388;
  local_388._1_1_ = local_358._24_4_ == 0;
  local_388._0_1_ = true;
  local_390 = (undefined1  [8])&PTR_streamReconstructedExpression_001eb2a0;
  local_388._3_5_ = SUB85(_Var2._M_p,3);
  local_388._2_1_ = 1;
  local_380 = (ITransientExpression *)0x1ab5ad;
  local_378 = (undefined1  [8])0x2;
  local_370._0_1_ = local_358._24_4_ == 0;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_3d8,(ITransientExpression *)local_390);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_390);
  Catch::AssertionHandler::complete((AssertionHandler *)local_3d8);
  if (local_39d == false) {
    (*local_398->_vptr_IResultCapture[0x13])();
  }
  local_390 = (undefined1  [8])0x1a94b4;
  local_388 = (pointer)0x214;
  macroName_16.m_size = 5;
  macroName_16.m_start = "CHECK";
  capturedExpression_16.m_size = 0x22;
  capturedExpression_16.m_start = "true == data.isEnergyIndependent()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_3d8,macroName_16,(SourceLineInfo *)local_390,
             capturedExpression_16,ContinueOnFailure);
  _Var2._M_p = local_388;
  local_388._1_1_ = local_358._24_4_ == 0;
  local_388._0_1_ = true;
  local_390 = (undefined1  [8])&PTR_streamReconstructedExpression_001eb2a0;
  local_388._3_5_ = SUB85(_Var2._M_p,3);
  local_388._2_1_ = 1;
  local_380 = (ITransientExpression *)0x1ab5ad;
  local_378 = (undefined1  [8])0x2;
  local_370._0_1_ = local_358._24_4_ == 0;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_3d8,(ITransientExpression *)local_390);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_390);
  Catch::AssertionHandler::complete((AssertionHandler *)local_3d8);
  if (local_39d == false) {
    (*local_398->_vptr_IResultCapture[0x13])();
  }
  local_390 = (undefined1  [8])0x1a94b4;
  local_388 = (pointer)0x215;
  macroName_17.m_size = 5;
  macroName_17.m_start = "CHECK";
  capturedExpression_17.m_size = 0xf;
  capturedExpression_17.m_start = "3 == data.NFP()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_3d8,macroName_17,(SourceLineInfo *)local_390,
             capturedExpression_17,ContinueOnFailure);
  local_388._1_1_ = local_358._0_4_ == 3;
  local_388._0_1_ = true;
  local_390 = (undefined1  [8])&PTR_streamReconstructedExpression_001eb220;
  local_388._4_4_ = 3;
  local_380 = (ITransientExpression *)0x1ab5ad;
  local_378 = (undefined1  [8])0x2;
  local_370 = local_358._0_4_;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_3d8,(ITransientExpression *)local_390);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_390);
  Catch::AssertionHandler::complete((AssertionHandler *)local_3d8);
  if (local_39d == false) {
    (*local_398->_vptr_IResultCapture[0x13])();
  }
  local_390 = (undefined1  [8])0x1a94b4;
  local_388 = (pointer)0x216;
  macroName_18.m_size = 5;
  macroName_18.m_start = "CHECK";
  capturedExpression_18.m_size = 0x21;
  capturedExpression_18.m_start = "3 == data.numberFissionProducts()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_3d8,macroName_18,(SourceLineInfo *)local_390,
             capturedExpression_18,ContinueOnFailure);
  local_388._1_1_ = local_358._0_4_ == 3;
  local_388._0_1_ = true;
  local_390 = (undefined1  [8])&PTR_streamReconstructedExpression_001eb220;
  local_388._4_4_ = 3;
  local_380 = (ITransientExpression *)0x1ab5ad;
  local_378 = (undefined1  [8])0x2;
  local_370 = local_358._0_4_;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_3d8,(ITransientExpression *)local_390);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_390);
  Catch::AssertionHandler::complete((AssertionHandler *)local_3d8);
  if (local_39d == false) {
    (*local_398->_vptr_IResultCapture[0x13])();
  }
  local_390 = (undefined1  [8])0x1a94b4;
  local_388 = (pointer)0x217;
  macroName_19.m_size = 10;
  macroName_19.m_start = "CHECK_THAT";
  capturedExpression_19.m_size = 0x19;
  capturedExpression_19.m_start = "0., WithinRel( data.E() )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_3d8,macroName_19,(SourceLineInfo *)local_390,
             capturedExpression_19,ContinueOnFailure);
  local_2c8 = (undefined1  [8])0x0;
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_390,(double)local_358._40_8_);
  bVar3 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_390,(double *)local_2c8);
  local_308.m_result = bVar3;
  local_308.m_isBinaryExpression = true;
  local_308._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001eb260;
  local_2f8 = (double *)local_2c8;
  local_2f0 = (WithinRelMatcher *)local_390;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_3d8,&local_308);
  Catch::ITransientExpression::~ITransientExpression(&local_308);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_390);
  Catch::AssertionHandler::complete((AssertionHandler *)local_3d8);
  if (local_39d == false) {
    (*local_398->_vptr_IResultCapture[0x13])();
  }
  local_390 = (undefined1  [8])0x1a94b4;
  local_388 = (pointer)0x218;
  macroName_20.m_size = 10;
  macroName_20.m_start = "CHECK_THAT";
  capturedExpression_20.m_size = 0x26;
  capturedExpression_20.m_start = "0., WithinRel( data.incidentEnergy() )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_3d8,macroName_20,(SourceLineInfo *)local_390,
             capturedExpression_20,ContinueOnFailure);
  local_2c8 = (undefined1  [8])0x0;
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_390,(double)local_358._40_8_);
  bVar3 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_390,(double *)local_2c8);
  local_308.m_result = bVar3;
  local_308.m_isBinaryExpression = true;
  local_308._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001eb260;
  local_2f8 = (double *)local_2c8;
  local_2f0 = (WithinRelMatcher *)local_390;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_3d8,&local_308);
  Catch::ITransientExpression::~ITransientExpression(&local_308);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_390);
  Catch::AssertionHandler::complete((AssertionHandler *)local_3d8);
  if (local_39d == false) {
    (*local_398->_vptr_IResultCapture[0x13])();
  }
  local_390 = (undefined1  [8])0x1a94b4;
  local_388 = (pointer)0x21a;
  macroName_21.m_size = 5;
  macroName_21.m_start = "CHECK";
  capturedExpression_21.m_size = 0x22;
  capturedExpression_21.m_start = "3 == data.fissionProducts().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_3d8,macroName_21,(SourceLineInfo *)local_390,
             capturedExpression_21,ContinueOnFailure);
  uVar5 = CONCAT44(local_328._12_4_,local_328._8_4_) - local_328._0_8_;
  _local_370 = (((ulong)((long)uVar5 >> 3) >> 2) + 1) - (ulong)((uVar5 & 0x18) == 0);
  local_388._1_1_ = _local_370 == 3;
  local_388._0_1_ = true;
  local_390 = (undefined1  [8])&PTR_streamReconstructedExpression_001eb320;
  local_388._4_4_ = 3;
  local_380 = (ITransientExpression *)0x1ab5ad;
  local_378 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_3d8,(ITransientExpression *)local_390);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_390);
  Catch::AssertionHandler::complete((AssertionHandler *)local_3d8);
  if (local_39d == false) {
    (*local_398->_vptr_IResultCapture[0x13])();
  }
  local_390 = (undefined1  [8])0x1a94b4;
  local_388 = (pointer)0x21b;
  macroName_22.m_size = 5;
  macroName_22.m_start = "CHECK";
  capturedExpression_22.m_size = 0x29;
  capturedExpression_22.m_start = "23066 == data.fissionProducts()[0].ZAFP()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_3d8,macroName_22,(SourceLineInfo *)local_390,
             capturedExpression_22,ContinueOnFailure);
  local_388._1_1_ = (int)(long)*(double *)local_328._0_8_ == 0x5a1a;
  local_388._0_1_ = true;
  local_390 = (undefined1  [8])&PTR_streamReconstructedExpression_001eb360;
  local_388._4_4_ = 0x5a1a;
  local_380 = (ITransientExpression *)0x1ab5ad;
  local_378 = (undefined1  [8])0x2;
  local_370 = (int)(long)*(double *)local_328._0_8_;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_3d8,(ITransientExpression *)local_390);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_390);
  Catch::AssertionHandler::complete((AssertionHandler *)local_3d8);
  if (local_39d == false) {
    (*local_398->_vptr_IResultCapture[0x13])();
  }
  local_390 = (undefined1  [8])0x1a94b4;
  local_388 = (pointer)0x21c;
  macroName_23.m_size = 5;
  macroName_23.m_start = "CHECK";
  capturedExpression_23.m_size = 0x29;
  capturedExpression_23.m_start = "54135 == data.fissionProducts()[1].ZAFP()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_3d8,macroName_23,(SourceLineInfo *)local_390,
             capturedExpression_23,ContinueOnFailure);
  pdVar6 = (double *)(local_328._0_8_ + 0x20);
  if ((ulong)((long)CONCAT44(local_328._12_4_,local_328._8_4_) - local_328._0_8_ >> 3) < 5) {
    pdVar6 = (double *)CONCAT44(local_328._12_4_,local_328._8_4_);
  }
  local_388._1_1_ = (int)(long)*pdVar6 == 0xd377;
  local_388._0_1_ = true;
  local_390 = (undefined1  [8])&PTR_streamReconstructedExpression_001eb360;
  local_388._4_4_ = 0xd377;
  local_380 = (ITransientExpression *)0x1ab5ad;
  local_378 = (undefined1  [8])0x2;
  local_370 = (int)(long)*pdVar6;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_3d8,(ITransientExpression *)local_390);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_390);
  Catch::AssertionHandler::complete((AssertionHandler *)local_3d8);
  if (local_39d == false) {
    (*local_398->_vptr_IResultCapture[0x13])();
  }
  local_390 = (undefined1  [8])0x1a94b4;
  local_388 = (pointer)0x21d;
  macroName_24.m_size = 5;
  macroName_24.m_start = "CHECK";
  capturedExpression_24.m_size = 0x29;
  capturedExpression_24.m_start = "72171 == data.fissionProducts()[2].ZAFP()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_3d8,macroName_24,(SourceLineInfo *)local_390,
             capturedExpression_24,ContinueOnFailure);
  pdVar6 = (double *)(local_328._0_8_ + 0x40);
  if ((ulong)((long)CONCAT44(local_328._12_4_,local_328._8_4_) - local_328._0_8_ >> 3) < 9) {
    pdVar6 = (double *)CONCAT44(local_328._12_4_,local_328._8_4_);
  }
  local_388._1_1_ = (int)(long)*pdVar6 == 0x119eb;
  local_388._0_1_ = true;
  local_390 = (undefined1  [8])&PTR_streamReconstructedExpression_001eb360;
  local_388._4_4_ = 0x119eb;
  local_380 = (ITransientExpression *)0x1ab5ad;
  local_378 = (undefined1  [8])0x2;
  local_370 = (int)(long)*pdVar6;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_3d8,(ITransientExpression *)local_390);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_390);
  Catch::AssertionHandler::complete((AssertionHandler *)local_3d8);
  if (local_39d == false) {
    (*local_398->_vptr_IResultCapture[0x13])();
  }
  local_390 = (undefined1  [8])0x1a94b4;
  local_388 = (pointer)0x21e;
  macroName_25.m_size = 5;
  macroName_25.m_start = "CHECK";
  capturedExpression_25.m_size = 0x3d;
  capturedExpression_25.m_start = "23066 == data.fissionProducts()[0].fissionProductIdentifier()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_3d8,macroName_25,(SourceLineInfo *)local_390,
             capturedExpression_25,ContinueOnFailure);
  local_388._1_1_ = (int)(long)*(double *)local_328._0_8_ == 0x5a1a;
  local_388._0_1_ = true;
  local_390 = (undefined1  [8])&PTR_streamReconstructedExpression_001eb360;
  local_388._4_4_ = 0x5a1a;
  local_380 = (ITransientExpression *)0x1ab5ad;
  local_378 = (undefined1  [8])0x2;
  local_370 = (int)(long)*(double *)local_328._0_8_;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_3d8,(ITransientExpression *)local_390);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_390);
  Catch::AssertionHandler::complete((AssertionHandler *)local_3d8);
  if (local_39d == false) {
    (*local_398->_vptr_IResultCapture[0x13])();
  }
  local_390 = (undefined1  [8])0x1a94b4;
  local_388 = (pointer)0x21f;
  macroName_26.m_size = 5;
  macroName_26.m_start = "CHECK";
  capturedExpression_26.m_size = 0x3d;
  capturedExpression_26.m_start = "54135 == data.fissionProducts()[1].fissionProductIdentifier()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_3d8,macroName_26,(SourceLineInfo *)local_390,
             capturedExpression_26,ContinueOnFailure);
  pdVar6 = (double *)(local_328._0_8_ + 0x20);
  if ((ulong)((long)CONCAT44(local_328._12_4_,local_328._8_4_) - local_328._0_8_ >> 3) < 5) {
    pdVar6 = (double *)CONCAT44(local_328._12_4_,local_328._8_4_);
  }
  local_388._1_1_ = (int)(long)*pdVar6 == 0xd377;
  local_388._0_1_ = true;
  local_390 = (undefined1  [8])&PTR_streamReconstructedExpression_001eb360;
  local_388._4_4_ = 0xd377;
  local_380 = (ITransientExpression *)0x1ab5ad;
  local_378 = (undefined1  [8])0x2;
  local_370 = (int)(long)*pdVar6;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_3d8,(ITransientExpression *)local_390);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_390);
  Catch::AssertionHandler::complete((AssertionHandler *)local_3d8);
  if (local_39d == false) {
    (*local_398->_vptr_IResultCapture[0x13])();
  }
  local_390 = (undefined1  [8])0x1a94b4;
  local_388 = (pointer)0x220;
  macroName_27.m_size = 5;
  macroName_27.m_start = "CHECK";
  capturedExpression_27.m_size = 0x3d;
  capturedExpression_27.m_start = "72171 == data.fissionProducts()[2].fissionProductIdentifier()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_3d8,macroName_27,(SourceLineInfo *)local_390,
             capturedExpression_27,ContinueOnFailure);
  pdVar6 = (double *)(local_328._0_8_ + 0x40);
  if ((ulong)((long)CONCAT44(local_328._12_4_,local_328._8_4_) - local_328._0_8_ >> 3) < 9) {
    pdVar6 = (double *)CONCAT44(local_328._12_4_,local_328._8_4_);
  }
  local_388._1_1_ = (int)(long)*pdVar6 == 0x119eb;
  local_388._0_1_ = true;
  local_390 = (undefined1  [8])&PTR_streamReconstructedExpression_001eb360;
  local_388._4_4_ = 0x119eb;
  local_380 = (ITransientExpression *)0x1ab5ad;
  local_378 = (undefined1  [8])0x2;
  local_370 = (int)(long)*pdVar6;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_3d8,(ITransientExpression *)local_390);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_390);
  Catch::AssertionHandler::complete((AssertionHandler *)local_3d8);
  if (local_39d == false) {
    (*local_398->_vptr_IResultCapture[0x13])();
  }
  local_390 = (undefined1  [8])0x1a94b4;
  local_388 = (pointer)0x221;
  macroName_28.m_size = 5;
  macroName_28.m_start = "CHECK";
  capturedExpression_28.m_size = 0x24;
  capturedExpression_28.m_start = "0 == data.fissionProducts()[0].FPS()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_3d8,macroName_28,(SourceLineInfo *)local_390,
             capturedExpression_28,ContinueOnFailure);
  local_388._1_1_ = (int)(long)*(double *)(local_328._0_8_ + 8) == 0;
  local_388._0_1_ = true;
  local_390 = (undefined1  [8])&PTR_streamReconstructedExpression_001eb360;
  local_388 = local_388 & 0xffffffff;
  local_380 = (ITransientExpression *)0x1ab5ad;
  local_378 = (undefined1  [8])0x2;
  local_370 = (int)(long)*(double *)(local_328._0_8_ + 8);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_3d8,(ITransientExpression *)local_390);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_390);
  Catch::AssertionHandler::complete((AssertionHandler *)local_3d8);
  if (local_39d == false) {
    (*local_398->_vptr_IResultCapture[0x13])();
  }
  local_390 = (undefined1  [8])0x1a94b4;
  local_388 = (pointer)0x222;
  macroName_29.m_size = 5;
  macroName_29.m_start = "CHECK";
  capturedExpression_29.m_size = 0x24;
  capturedExpression_29.m_start = "0 == data.fissionProducts()[1].FPS()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_3d8,macroName_29,(SourceLineInfo *)local_390,
             capturedExpression_29,ContinueOnFailure);
  pdVar6 = (double *)(local_328._0_8_ + 0x20);
  if ((ulong)((long)CONCAT44(local_328._12_4_,local_328._8_4_) - local_328._0_8_ >> 3) < 5) {
    pdVar6 = (double *)CONCAT44(local_328._12_4_,local_328._8_4_);
  }
  local_388._1_1_ = (int)(long)pdVar6[1] == 0;
  local_388._0_1_ = true;
  local_390 = (undefined1  [8])&PTR_streamReconstructedExpression_001eb360;
  local_388 = local_388 & 0xffffffff;
  local_380 = (ITransientExpression *)0x1ab5ad;
  local_378 = (undefined1  [8])0x2;
  local_370 = (int)(long)pdVar6[1];
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_3d8,(ITransientExpression *)local_390);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_390);
  Catch::AssertionHandler::complete((AssertionHandler *)local_3d8);
  if (local_39d == false) {
    (*local_398->_vptr_IResultCapture[0x13])();
  }
  local_390 = (undefined1  [8])0x1a94b4;
  local_388 = (pointer)0x223;
  macroName_30.m_size = 5;
  macroName_30.m_start = "CHECK";
  capturedExpression_30.m_size = 0x24;
  capturedExpression_30.m_start = "0 == data.fissionProducts()[2].FPS()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_3d8,macroName_30,(SourceLineInfo *)local_390,
             capturedExpression_30,ContinueOnFailure);
  pdVar6 = (double *)(local_328._0_8_ + 0x40);
  if ((ulong)((long)CONCAT44(local_328._12_4_,local_328._8_4_) - local_328._0_8_ >> 3) < 9) {
    pdVar6 = (double *)CONCAT44(local_328._12_4_,local_328._8_4_);
  }
  local_388._1_1_ = (int)(long)pdVar6[1] == 0;
  local_388._0_1_ = true;
  local_390 = (undefined1  [8])&PTR_streamReconstructedExpression_001eb360;
  local_388 = local_388 & 0xffffffff;
  local_380 = (ITransientExpression *)0x1ab5ad;
  local_378 = (undefined1  [8])0x2;
  local_370 = (int)(long)pdVar6[1];
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_3d8,(ITransientExpression *)local_390);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_390);
  Catch::AssertionHandler::complete((AssertionHandler *)local_3d8);
  if (local_39d == false) {
    (*local_398->_vptr_IResultCapture[0x13])();
  }
  local_390 = (undefined1  [8])0x1a94b4;
  local_388 = (pointer)0x224;
  macroName_31.m_size = 5;
  macroName_31.m_start = "CHECK";
  capturedExpression_31.m_size = 0x2e;
  capturedExpression_31.m_start = "0 == data.fissionProducts()[0].isomericState()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_3d8,macroName_31,(SourceLineInfo *)local_390,
             capturedExpression_31,ContinueOnFailure);
  local_388._1_1_ = (int)(long)*(double *)(local_328._0_8_ + 8) == 0;
  local_388._0_1_ = true;
  local_390 = (undefined1  [8])&PTR_streamReconstructedExpression_001eb360;
  local_388 = local_388 & 0xffffffff;
  local_380 = (ITransientExpression *)0x1ab5ad;
  local_378 = (undefined1  [8])0x2;
  local_370 = (int)(long)*(double *)(local_328._0_8_ + 8);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_3d8,(ITransientExpression *)local_390);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_390);
  Catch::AssertionHandler::complete((AssertionHandler *)local_3d8);
  if (local_39d == false) {
    (*local_398->_vptr_IResultCapture[0x13])();
  }
  local_390 = (undefined1  [8])0x1a94b4;
  local_388 = (pointer)0x225;
  macroName_32.m_size = 5;
  macroName_32.m_start = "CHECK";
  capturedExpression_32.m_size = 0x2e;
  capturedExpression_32.m_start = "0 == data.fissionProducts()[1].isomericState()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_3d8,macroName_32,(SourceLineInfo *)local_390,
             capturedExpression_32,ContinueOnFailure);
  pdVar6 = (double *)(local_328._0_8_ + 0x20);
  if ((ulong)((long)CONCAT44(local_328._12_4_,local_328._8_4_) - local_328._0_8_ >> 3) < 5) {
    pdVar6 = (double *)CONCAT44(local_328._12_4_,local_328._8_4_);
  }
  local_388._1_1_ = (int)(long)pdVar6[1] == 0;
  local_388._0_1_ = true;
  local_390 = (undefined1  [8])&PTR_streamReconstructedExpression_001eb360;
  local_388 = local_388 & 0xffffffff;
  local_380 = (ITransientExpression *)0x1ab5ad;
  local_378 = (undefined1  [8])0x2;
  local_370 = (int)(long)pdVar6[1];
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_3d8,(ITransientExpression *)local_390);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_390);
  Catch::AssertionHandler::complete((AssertionHandler *)local_3d8);
  if (local_39d == false) {
    (*local_398->_vptr_IResultCapture[0x13])();
  }
  local_390 = (undefined1  [8])0x1a94b4;
  local_388 = (pointer)0x226;
  macroName_33.m_size = 5;
  macroName_33.m_start = "CHECK";
  capturedExpression_33.m_size = 0x2e;
  capturedExpression_33.m_start = "0 == data.fissionProducts()[2].isomericState()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_3d8,macroName_33,(SourceLineInfo *)local_390,
             capturedExpression_33,ContinueOnFailure);
  pdVar6 = (double *)(local_328._0_8_ + 0x40);
  if ((ulong)((long)CONCAT44(local_328._12_4_,local_328._8_4_) - local_328._0_8_ >> 3) < 9) {
    pdVar6 = (double *)CONCAT44(local_328._12_4_,local_328._8_4_);
  }
  local_388._1_1_ = (int)(long)pdVar6[1] == 0;
  local_388._0_1_ = true;
  local_390 = (undefined1  [8])&PTR_streamReconstructedExpression_001eb360;
  local_388 = local_388 & 0xffffffff;
  local_380 = (ITransientExpression *)0x1ab5ad;
  local_378 = (undefined1  [8])0x2;
  local_370 = (int)(long)pdVar6[1];
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_3d8,(ITransientExpression *)local_390);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_390);
  Catch::AssertionHandler::complete((AssertionHandler *)local_3d8);
  if (local_39d == false) {
    (*local_398->_vptr_IResultCapture[0x13])();
  }
  local_390 = (undefined1  [8])0x1a94b4;
  local_388 = (pointer)0x227;
  macroName_34.m_size = 10;
  macroName_34.m_start = "CHECK_THAT";
  capturedExpression_34.m_size = 0x3a;
  capturedExpression_34.m_start = "2.05032e-19, WithinRel( data.fissionProducts()[0].Y()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_3d8,macroName_34,(SourceLineInfo *)local_390,
             capturedExpression_34,ContinueOnFailure);
  local_2c8 = (undefined1  [8])0x3c0e41e3d444ff46;
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_390,*(double *)(local_328._0_8_ + 0x10));
  bVar3 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_390,(double *)local_2c8);
  local_308.m_result = bVar3;
  local_308.m_isBinaryExpression = true;
  local_308._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001eb260;
  local_2f8 = (double *)local_2c8;
  local_2f0 = (WithinRelMatcher *)local_390;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_3d8,&local_308);
  Catch::ITransientExpression::~ITransientExpression(&local_308);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_390);
  Catch::AssertionHandler::complete((AssertionHandler *)local_3d8);
  if (local_39d == false) {
    (*local_398->_vptr_IResultCapture[0x13])();
  }
  local_390 = (undefined1  [8])0x1a94b4;
  local_388 = (pointer)0x228;
  macroName_35.m_size = 10;
  macroName_35.m_start = "CHECK_THAT";
  capturedExpression_35.m_size = 0x3a;
  capturedExpression_35.m_start = "1.31220e-19, WithinRel( data.fissionProducts()[0].Y()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_3d8,macroName_35,(SourceLineInfo *)local_390,
             capturedExpression_35,ContinueOnFailure);
  local_2c8 = (undefined1  [8])0x3c035d59f7e8f961;
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_390,*(double *)(local_328._0_8_ + 0x18));
  bVar3 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_390,(double *)local_2c8);
  local_308.m_result = bVar3;
  local_308.m_isBinaryExpression = true;
  local_308._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001eb260;
  local_2f8 = (double *)local_2c8;
  local_2f0 = (WithinRelMatcher *)local_390;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_3d8,&local_308);
  Catch::ITransientExpression::~ITransientExpression(&local_308);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_390);
  Catch::AssertionHandler::complete((AssertionHandler *)local_3d8);
  if (local_39d == false) {
    (*local_398->_vptr_IResultCapture[0x13])();
  }
  local_390 = (undefined1  [8])0x1a94b4;
  local_388 = (pointer)0x229;
  macroName_36.m_size = 10;
  macroName_36.m_start = "CHECK_THAT";
  capturedExpression_36.m_size = 0x3a;
  capturedExpression_36.m_start = "7.851250e-4, WithinRel( data.fissionProducts()[1].Y()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_3d8,macroName_36,(SourceLineInfo *)local_390,
             capturedExpression_36,ContinueOnFailure);
  local_2c8 = (undefined1  [8])0x3f49ba1b1960fa16;
  pdVar6 = (double *)(local_328._0_8_ + 0x20);
  if ((ulong)((long)CONCAT44(local_328._12_4_,local_328._8_4_) - local_328._0_8_ >> 3) < 5) {
    pdVar6 = (double *)CONCAT44(local_328._12_4_,local_328._8_4_);
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_390,pdVar6[2]);
  bVar3 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_390,(double *)local_2c8);
  local_308.m_result = bVar3;
  local_308.m_isBinaryExpression = true;
  local_308._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001eb260;
  local_2f8 = (double *)local_2c8;
  local_2f0 = (WithinRelMatcher *)local_390;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_3d8,&local_308);
  Catch::ITransientExpression::~ITransientExpression(&local_308);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_390);
  Catch::AssertionHandler::complete((AssertionHandler *)local_3d8);
  if (local_39d == false) {
    (*local_398->_vptr_IResultCapture[0x13])();
  }
  local_390 = (undefined1  [8])0x1a94b4;
  local_388 = (pointer)0x22a;
  macroName_37.m_size = 10;
  macroName_37.m_start = "CHECK_THAT";
  capturedExpression_37.m_size = 0x3a;
  capturedExpression_37.m_start = "4.710750e-5, WithinRel( data.fissionProducts()[1].Y()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_3d8,macroName_37,(SourceLineInfo *)local_390,
             capturedExpression_37,ContinueOnFailure);
  local_2c8 = (undefined1  [8])0x3f08b2a9600b2d86;
  pdVar6 = (double *)(local_328._0_8_ + 0x20);
  if ((ulong)((long)CONCAT44(local_328._12_4_,local_328._8_4_) - local_328._0_8_ >> 3) < 5) {
    pdVar6 = (double *)CONCAT44(local_328._12_4_,local_328._8_4_);
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_390,pdVar6[3]);
  bVar3 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_390,(double *)local_2c8);
  local_308.m_result = bVar3;
  local_308.m_isBinaryExpression = true;
  local_308._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001eb260;
  local_2f8 = (double *)local_2c8;
  local_2f0 = (WithinRelMatcher *)local_390;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_3d8,&local_308);
  Catch::ITransientExpression::~ITransientExpression(&local_308);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_390);
  Catch::AssertionHandler::complete((AssertionHandler *)local_3d8);
  if (local_39d == false) {
    (*local_398->_vptr_IResultCapture[0x13])();
  }
  local_390 = (undefined1  [8])0x1a94b4;
  local_388 = (pointer)0x22b;
  macroName_38.m_size = 10;
  macroName_38.m_start = "CHECK_THAT";
  capturedExpression_38.m_size = 0x30;
  capturedExpression_38.m_start = "0, WithinRel( data.fissionProducts()[2].Y()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_3d8,macroName_38,(SourceLineInfo *)local_390,
             capturedExpression_38,ContinueOnFailure);
  local_2c8 = (undefined1  [8])((ulong)local_2c8 & 0xffffffff00000000);
  pdVar6 = (double *)(local_328._0_8_ + 0x40);
  if ((ulong)((long)CONCAT44(local_328._12_4_,local_328._8_4_) - local_328._0_8_ >> 3) < 9) {
    pdVar6 = (double *)CONCAT44(local_328._12_4_,local_328._8_4_);
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_390,pdVar6[2]);
  local_1d0 = (double)(int)local_2c8._0_4_;
  bVar3 = Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_390,&local_1d0);
  local_308.m_result = bVar3;
  local_308.m_isBinaryExpression = true;
  local_308._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001eb3a0;
  local_2f8 = (double *)local_2c8;
  local_2f0 = (WithinRelMatcher *)local_390;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_3d8,&local_308);
  Catch::ITransientExpression::~ITransientExpression(&local_308);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_390);
  Catch::AssertionHandler::complete((AssertionHandler *)local_3d8);
  if (local_39d == false) {
    (*local_398->_vptr_IResultCapture[0x13])();
  }
  local_390 = (undefined1  [8])0x1a94b4;
  local_388 = (pointer)0x22c;
  macroName_39.m_size = 10;
  macroName_39.m_start = "CHECK_THAT";
  capturedExpression_39.m_size = 0x30;
  capturedExpression_39.m_start = "0, WithinRel( data.fissionProducts()[2].Y()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_3d8,macroName_39,(SourceLineInfo *)local_390,
             capturedExpression_39,ContinueOnFailure);
  local_2c8 = (undefined1  [8])((ulong)local_2c8 & 0xffffffff00000000);
  pdVar6 = (double *)(local_328._0_8_ + 0x40);
  if ((ulong)((long)CONCAT44(local_328._12_4_,local_328._8_4_) - local_328._0_8_ >> 3) < 9) {
    pdVar6 = (double *)CONCAT44(local_328._12_4_,local_328._8_4_);
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_390,pdVar6[3]);
  local_1c8 = (double)(int)local_2c8._0_4_;
  bVar3 = Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_390,&local_1c8);
  local_308.m_result = bVar3;
  local_308.m_isBinaryExpression = true;
  local_308._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001eb3a0;
  local_2f8 = (double *)local_2c8;
  local_2f0 = (WithinRelMatcher *)local_390;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_3d8,&local_308);
  Catch::ITransientExpression::~ITransientExpression(&local_308);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_390);
  Catch::AssertionHandler::complete((AssertionHandler *)local_3d8);
  if (local_39d == false) {
    (*local_398->_vptr_IResultCapture[0x13])();
  }
  local_390 = (undefined1  [8])0x1a94b4;
  local_388 = (pointer)0x22e;
  macroName_40.m_size = 5;
  macroName_40.m_start = "CHECK";
  capturedExpression_40.m_size = 0x17;
  capturedExpression_40.m_start = "3 == data.ZAFP().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_3d8,macroName_40,(SourceLineInfo *)local_390,
             capturedExpression_40,ContinueOnFailure);
  _local_370 = (CONCAT44(local_328._12_4_,local_328._8_4_) - local_328._0_8_ >> 3) + 3U >> 2;
  local_388._1_1_ = _local_370 == 3;
  local_388._0_1_ = true;
  local_390 = (undefined1  [8])&PTR_streamReconstructedExpression_001eb320;
  local_388._4_4_ = 3;
  local_380 = (ITransientExpression *)0x1ab5ad;
  local_378 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_3d8,(ITransientExpression *)local_390);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_390);
  Catch::AssertionHandler::complete((AssertionHandler *)local_3d8);
  if (local_39d == false) {
    (*local_398->_vptr_IResultCapture[0x13])();
  }
  local_390 = (undefined1  [8])0x1a94b4;
  local_388 = (pointer)0x22f;
  macroName_41.m_size = 5;
  macroName_41.m_start = "CHECK";
  capturedExpression_41.m_size = 0x2c;
  capturedExpression_41.m_start = "3 == data.fissionProductIdentifiers().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_3d8,macroName_41,(SourceLineInfo *)local_390,
             capturedExpression_41,ContinueOnFailure);
  _local_370 = (CONCAT44(local_328._12_4_,local_328._8_4_) - local_328._0_8_ >> 3) + 3U >> 2;
  local_388._1_1_ = _local_370 == 3;
  local_388._0_1_ = true;
  local_390 = (undefined1  [8])&PTR_streamReconstructedExpression_001eb320;
  local_388._4_4_ = 3;
  local_380 = (ITransientExpression *)0x1ab5ad;
  local_378 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_3d8,(ITransientExpression *)local_390);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_390);
  Catch::AssertionHandler::complete((AssertionHandler *)local_3d8);
  if (local_39d == false) {
    (*local_398->_vptr_IResultCapture[0x13])();
  }
  local_390 = (undefined1  [8])0x1a94b4;
  local_388 = (pointer)0x230;
  macroName_42.m_size = 5;
  macroName_42.m_start = "CHECK";
  capturedExpression_42.m_size = 0x16;
  capturedExpression_42.m_start = "3 == data.FPS().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_3d8,macroName_42,(SourceLineInfo *)local_390,
             capturedExpression_42,ContinueOnFailure);
  _local_370 = ((CONCAT44(local_328._12_4_,local_328._8_4_) - local_328._0_8_) + -8 >> 3) + 3U >> 2;
  local_388._1_1_ = _local_370 == 3;
  local_388._0_1_ = true;
  local_390 = (undefined1  [8])&PTR_streamReconstructedExpression_001eb320;
  local_388._4_4_ = 3;
  local_380 = (ITransientExpression *)0x1ab5ad;
  local_378 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_3d8,(ITransientExpression *)local_390);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_390);
  Catch::AssertionHandler::complete((AssertionHandler *)local_3d8);
  if (local_39d == false) {
    (*local_398->_vptr_IResultCapture[0x13])();
  }
  local_390 = (undefined1  [8])0x1a94b4;
  local_388 = (pointer)0x231;
  macroName_43.m_size = 5;
  macroName_43.m_start = "CHECK";
  capturedExpression_43.m_size = 0x21;
  capturedExpression_43.m_start = "3 == data.isomericStates().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_3d8,macroName_43,(SourceLineInfo *)local_390,
             capturedExpression_43,ContinueOnFailure);
  _local_370 = ((CONCAT44(local_328._12_4_,local_328._8_4_) - local_328._0_8_) + -8 >> 3) + 3U >> 2;
  local_388._1_1_ = _local_370 == 3;
  local_388._0_1_ = true;
  local_390 = (undefined1  [8])&PTR_streamReconstructedExpression_001eb320;
  local_388._4_4_ = 3;
  local_380 = (ITransientExpression *)0x1ab5ad;
  local_378 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_3d8,(ITransientExpression *)local_390);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_390);
  Catch::AssertionHandler::complete((AssertionHandler *)local_3d8);
  if (local_39d == false) {
    (*local_398->_vptr_IResultCapture[0x13])();
  }
  local_390 = (undefined1  [8])0x1a94b4;
  local_388 = (pointer)0x232;
  macroName_44.m_size = 5;
  macroName_44.m_start = "CHECK";
  capturedExpression_44.m_size = 0x14;
  capturedExpression_44.m_start = "3 == data.Y().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_3d8,macroName_44,(SourceLineInfo *)local_390,
             capturedExpression_44,ContinueOnFailure);
  lVar4 = (CONCAT44(local_328._12_4_,local_328._8_4_) - local_328._0_8_) + -0x10;
  _local_370 = ((ulong)(lVar4 >> 3) >> 1) + 1 + (ulong)(((uint)lVar4 >> 3 & 1) != 0) >> 1;
  local_388._1_1_ = _local_370 == 3;
  local_388._0_1_ = true;
  local_390 = (undefined1  [8])&PTR_streamReconstructedExpression_001eb320;
  local_388._4_4_ = 3;
  local_380 = (ITransientExpression *)0x1ab5ad;
  local_378 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_3d8,(ITransientExpression *)local_390);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_390);
  Catch::AssertionHandler::complete((AssertionHandler *)local_3d8);
  if (local_39d == false) {
    (*local_398->_vptr_IResultCapture[0x13])();
  }
  local_390 = (undefined1  [8])0x1a94b4;
  local_388 = (pointer)0x233;
  macroName_45.m_size = 5;
  macroName_45.m_start = "CHECK";
  capturedExpression_45.m_size = 0x20;
  capturedExpression_45.m_start = "3 == data.fissionYields().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_3d8,macroName_45,(SourceLineInfo *)local_390,
             capturedExpression_45,ContinueOnFailure);
  lVar4 = (CONCAT44(local_328._12_4_,local_328._8_4_) - local_328._0_8_) + -0x10;
  _local_370 = ((ulong)(lVar4 >> 3) >> 1) + 1 + (ulong)(((uint)lVar4 >> 3 & 1) != 0) >> 1;
  local_388._1_1_ = _local_370 == 3;
  local_388._0_1_ = true;
  local_390 = (undefined1  [8])&PTR_streamReconstructedExpression_001eb320;
  local_388._4_4_ = 3;
  local_380 = (ITransientExpression *)0x1ab5ad;
  local_378 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_3d8,(ITransientExpression *)local_390);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_390);
  Catch::AssertionHandler::complete((AssertionHandler *)local_3d8);
  if (local_39d == false) {
    (*local_398->_vptr_IResultCapture[0x13])();
  }
  local_390 = (undefined1  [8])0x1a94b4;
  local_388 = (pointer)0x234;
  macroName_46.m_size = 5;
  macroName_46.m_start = "CHECK";
  capturedExpression_46.m_size = 0x17;
  capturedExpression_46.m_start = "23066 == data.ZAFP()[0]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_3d8,macroName_46,(SourceLineInfo *)local_390,
             capturedExpression_46,ContinueOnFailure);
  _local_370 = *(undefined8 *)local_328._0_8_;
  local_388._1_1_ = (double)_local_370 == 23066.0;
  local_388._0_1_ = true;
  local_390 = (undefined1  [8])&PTR_streamReconstructedExpression_001eb3e0;
  local_388._4_4_ = 0x5a1a;
  local_380 = (ITransientExpression *)0x1ab5ad;
  local_378 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_3d8,(ITransientExpression *)local_390);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_390);
  Catch::AssertionHandler::complete((AssertionHandler *)local_3d8);
  if (local_39d == false) {
    (*local_398->_vptr_IResultCapture[0x13])();
  }
  local_390 = (undefined1  [8])0x1a94b4;
  local_388 = (pointer)0x235;
  macroName_47.m_size = 5;
  macroName_47.m_start = "CHECK";
  capturedExpression_47.m_size = 0x17;
  capturedExpression_47.m_start = "54135 == data.ZAFP()[1]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_3d8,macroName_47,(SourceLineInfo *)local_390,
             capturedExpression_47,ContinueOnFailure);
  local_2f8 = (double *)local_328._0_8_;
  local_2f0 = (WithinRelMatcher *)0x4;
  lVar4 = (CONCAT44(local_328._12_4_,local_328._8_4_) - local_328._0_8_ >> 3) % 4;
  local_2e8 = 4 - lVar4;
  if (lVar4 == 0) {
    local_2e8 = 0;
  }
  local_250._M_current = (double *)local_328._0_8_;
  local_248 = &local_308;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_248,&local_250,1);
  _local_370 = *local_250._M_current;
  local_388._1_1_ = (double)_local_370 == 54135.0;
  local_388._0_1_ = true;
  local_390 = (undefined1  [8])&PTR_streamReconstructedExpression_001eb3e0;
  local_388._4_4_ = 0xd377;
  local_380 = (ITransientExpression *)0x1ab5ad;
  local_378 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_3d8,(ITransientExpression *)local_390);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_390);
  Catch::AssertionHandler::complete((AssertionHandler *)local_3d8);
  if (local_39d == false) {
    (*local_398->_vptr_IResultCapture[0x13])();
  }
  local_390 = (undefined1  [8])0x1a94b4;
  local_388 = (pointer)0x236;
  macroName_48.m_size = 5;
  macroName_48.m_start = "CHECK";
  capturedExpression_48.m_size = 0x17;
  capturedExpression_48.m_start = "72171 == data.ZAFP()[2]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_3d8,macroName_48,(SourceLineInfo *)local_390,
             capturedExpression_48,ContinueOnFailure);
  local_2f8 = (double *)local_328._0_8_;
  local_2f0 = (WithinRelMatcher *)0x4;
  lVar4 = (CONCAT44(local_328._12_4_,local_328._8_4_) - local_328._0_8_ >> 3) % 4;
  local_2e8 = 4 - lVar4;
  if (lVar4 == 0) {
    local_2e8 = 0;
  }
  local_240._M_current = (double *)local_328._0_8_;
  local_238 = &local_308;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_238,&local_240,2);
  _local_370 = *local_240._M_current;
  local_388._1_1_ = (double)_local_370 == 72171.0;
  local_388._0_1_ = true;
  local_390 = (undefined1  [8])&PTR_streamReconstructedExpression_001eb3e0;
  local_388._4_4_ = 0x119eb;
  local_380 = (ITransientExpression *)0x1ab5ad;
  local_378 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_3d8,(ITransientExpression *)local_390);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_390);
  Catch::AssertionHandler::complete((AssertionHandler *)local_3d8);
  if (local_39d == false) {
    (*local_398->_vptr_IResultCapture[0x13])();
  }
  local_390 = (undefined1  [8])0x1a94b4;
  local_388 = (pointer)0x237;
  macroName_49.m_size = 5;
  macroName_49.m_start = "CHECK";
  capturedExpression_49.m_size = 0x2c;
  capturedExpression_49.m_start = "23066 == data.fissionProductIdentifiers()[0]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_3d8,macroName_49,(SourceLineInfo *)local_390,
             capturedExpression_49,ContinueOnFailure);
  _local_370 = *(undefined8 *)local_328._0_8_;
  local_388._1_1_ = (double)_local_370 == 23066.0;
  local_388._0_1_ = true;
  local_390 = (undefined1  [8])&PTR_streamReconstructedExpression_001eb3e0;
  local_388._4_4_ = 0x5a1a;
  local_380 = (ITransientExpression *)0x1ab5ad;
  local_378 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_3d8,(ITransientExpression *)local_390);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_390);
  Catch::AssertionHandler::complete((AssertionHandler *)local_3d8);
  if (local_39d == false) {
    (*local_398->_vptr_IResultCapture[0x13])();
  }
  local_390 = (undefined1  [8])0x1a94b4;
  local_388 = (pointer)0x238;
  macroName_50.m_size = 5;
  macroName_50.m_start = "CHECK";
  capturedExpression_50.m_size = 0x2c;
  capturedExpression_50.m_start = "54135 == data.fissionProductIdentifiers()[1]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_3d8,macroName_50,(SourceLineInfo *)local_390,
             capturedExpression_50,ContinueOnFailure);
  local_2f8 = (double *)local_328._0_8_;
  local_2f0 = (WithinRelMatcher *)0x4;
  lVar4 = (CONCAT44(local_328._12_4_,local_328._8_4_) - local_328._0_8_ >> 3) % 4;
  local_2e8 = 4 - lVar4;
  if (lVar4 == 0) {
    local_2e8 = 0;
  }
  local_230._M_current = (double *)local_328._0_8_;
  local_228 = &local_308;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_228,&local_230,1);
  _local_370 = *local_230._M_current;
  local_388._1_1_ = (double)_local_370 == 54135.0;
  local_388._0_1_ = true;
  local_390 = (undefined1  [8])&PTR_streamReconstructedExpression_001eb3e0;
  local_388._4_4_ = 0xd377;
  local_380 = (ITransientExpression *)0x1ab5ad;
  local_378 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_3d8,(ITransientExpression *)local_390);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_390);
  Catch::AssertionHandler::complete((AssertionHandler *)local_3d8);
  if (local_39d == false) {
    (*local_398->_vptr_IResultCapture[0x13])();
  }
  local_390 = (undefined1  [8])0x1a94b4;
  local_388 = (pointer)0x239;
  macroName_51.m_size = 5;
  macroName_51.m_start = "CHECK";
  capturedExpression_51.m_size = 0x2c;
  capturedExpression_51.m_start = "72171 == data.fissionProductIdentifiers()[2]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_3d8,macroName_51,(SourceLineInfo *)local_390,
             capturedExpression_51,ContinueOnFailure);
  local_2f8 = (double *)local_328._0_8_;
  local_2f0 = (WithinRelMatcher *)0x4;
  lVar4 = (CONCAT44(local_328._12_4_,local_328._8_4_) - local_328._0_8_ >> 3) % 4;
  local_2e8 = 4 - lVar4;
  if (lVar4 == 0) {
    local_2e8 = 0;
  }
  local_220._M_current = (double *)local_328._0_8_;
  local_218 = &local_308;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_218,&local_220,2);
  _local_370 = *local_220._M_current;
  local_388._1_1_ = (double)_local_370 == 72171.0;
  local_388._0_1_ = true;
  local_390 = (undefined1  [8])&PTR_streamReconstructedExpression_001eb3e0;
  local_388._4_4_ = 0x119eb;
  local_380 = (ITransientExpression *)0x1ab5ad;
  local_378 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_3d8,(ITransientExpression *)local_390);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_390);
  Catch::AssertionHandler::complete((AssertionHandler *)local_3d8);
  if (local_39d == false) {
    (*local_398->_vptr_IResultCapture[0x13])();
  }
  local_390 = (undefined1  [8])0x1a94b4;
  local_388 = (pointer)0x23a;
  macroName_52.m_size = 5;
  macroName_52.m_start = "CHECK";
  capturedExpression_52.m_size = 0x12;
  capturedExpression_52.m_start = "0 == data.FPS()[0]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_3d8,macroName_52,(SourceLineInfo *)local_390,
             capturedExpression_52,ContinueOnFailure);
  _local_370 = *(double *)(local_328._0_8_ + 8);
  local_388._1_1_ = (double)_local_370 == 0.0;
  local_388._0_1_ = true;
  local_390 = (undefined1  [8])&PTR_streamReconstructedExpression_001eb3e0;
  local_388 = local_388 & 0xffffffff;
  local_380 = (ITransientExpression *)0x1ab5ad;
  local_378 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_3d8,(ITransientExpression *)local_390);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_390);
  Catch::AssertionHandler::complete((AssertionHandler *)local_3d8);
  if (local_39d == false) {
    (*local_398->_vptr_IResultCapture[0x13])();
  }
  local_390 = (undefined1  [8])0x1a94b4;
  local_388 = (pointer)0x23b;
  macroName_53.m_size = 5;
  macroName_53.m_start = "CHECK";
  capturedExpression_53.m_size = 0x12;
  capturedExpression_53.m_start = "0 == data.FPS()[1]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_3d8,macroName_53,(SourceLineInfo *)local_390,
             capturedExpression_53,ContinueOnFailure);
  local_2f8 = (double *)(local_328._0_8_ + 8);
  local_2f0 = (WithinRelMatcher *)0x4;
  lVar4 = (CONCAT44(local_328._12_4_,local_328._8_4_) - (long)local_2f8 >> 3) % 4;
  local_2e8 = 4 - lVar4;
  if (lVar4 == 0) {
    local_2e8 = 0;
  }
  local_210._M_current = local_2f8;
  local_208 = &local_308;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_208,&local_210,1);
  _local_370 = *local_210._M_current;
  local_388._1_1_ = (double)_local_370 == 0.0;
  local_388._0_1_ = true;
  local_390 = (undefined1  [8])&PTR_streamReconstructedExpression_001eb3e0;
  local_388 = local_388 & 0xffffffff;
  local_380 = (ITransientExpression *)0x1ab5ad;
  local_378 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_3d8,(ITransientExpression *)local_390);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_390);
  Catch::AssertionHandler::complete((AssertionHandler *)local_3d8);
  if (local_39d == false) {
    (*local_398->_vptr_IResultCapture[0x13])();
  }
  local_390 = (undefined1  [8])0x1a94b4;
  local_388 = (pointer)0x23c;
  macroName_54.m_size = 5;
  macroName_54.m_start = "CHECK";
  capturedExpression_54.m_size = 0x12;
  capturedExpression_54.m_start = "0 == data.FPS()[2]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_3d8,macroName_54,(SourceLineInfo *)local_390,
             capturedExpression_54,ContinueOnFailure);
  local_2f8 = (double *)(local_328._0_8_ + 8);
  local_2f0 = (WithinRelMatcher *)0x4;
  lVar4 = (CONCAT44(local_328._12_4_,local_328._8_4_) - (long)local_2f8 >> 3) % 4;
  local_2e8 = 4 - lVar4;
  if (lVar4 == 0) {
    local_2e8 = 0;
  }
  local_200._M_current = local_2f8;
  local_1f8 = &local_308;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_1f8,&local_200,2);
  _local_370 = *local_200._M_current;
  local_388._1_1_ = (double)_local_370 == 0.0;
  local_388._0_1_ = true;
  local_390 = (undefined1  [8])&PTR_streamReconstructedExpression_001eb3e0;
  local_388 = local_388 & 0xffffffff;
  local_380 = (ITransientExpression *)0x1ab5ad;
  local_378 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_3d8,(ITransientExpression *)local_390);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_390);
  Catch::AssertionHandler::complete((AssertionHandler *)local_3d8);
  if (local_39d == false) {
    (*local_398->_vptr_IResultCapture[0x13])();
  }
  local_390 = (undefined1  [8])0x1a94b4;
  local_388 = (pointer)0x23d;
  macroName_55.m_size = 5;
  macroName_55.m_start = "CHECK";
  capturedExpression_55.m_size = 0x1d;
  capturedExpression_55.m_start = "0 == data.isomericStates()[0]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_3d8,macroName_55,(SourceLineInfo *)local_390,
             capturedExpression_55,ContinueOnFailure);
  _local_370 = *(double *)(local_328._0_8_ + 8);
  local_388._1_1_ = (double)_local_370 == 0.0;
  local_388._0_1_ = true;
  local_390 = (undefined1  [8])&PTR_streamReconstructedExpression_001eb3e0;
  local_388 = local_388 & 0xffffffff;
  local_380 = (ITransientExpression *)0x1ab5ad;
  local_378 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_3d8,(ITransientExpression *)local_390);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_390);
  Catch::AssertionHandler::complete((AssertionHandler *)local_3d8);
  if (local_39d == false) {
    (*local_398->_vptr_IResultCapture[0x13])();
  }
  local_390 = (undefined1  [8])0x1a94b4;
  local_388 = (pointer)0x23e;
  macroName_56.m_size = 5;
  macroName_56.m_start = "CHECK";
  capturedExpression_56.m_size = 0x1d;
  capturedExpression_56.m_start = "0 == data.isomericStates()[1]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_3d8,macroName_56,(SourceLineInfo *)local_390,
             capturedExpression_56,ContinueOnFailure);
  local_2f8 = (double *)(local_328._0_8_ + 8);
  local_2f0 = (WithinRelMatcher *)0x4;
  lVar4 = (CONCAT44(local_328._12_4_,local_328._8_4_) - (long)local_2f8 >> 3) % 4;
  local_2e8 = 4 - lVar4;
  if (lVar4 == 0) {
    local_2e8 = 0;
  }
  local_1f0._M_current = local_2f8;
  local_1e8 = &local_308;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_1e8,&local_1f0,1);
  _local_370 = *local_1f0._M_current;
  local_388._1_1_ = (double)_local_370 == 0.0;
  local_388._0_1_ = true;
  local_390 = (undefined1  [8])&PTR_streamReconstructedExpression_001eb3e0;
  local_388 = local_388 & 0xffffffff;
  local_380 = (ITransientExpression *)0x1ab5ad;
  local_378 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_3d8,(ITransientExpression *)local_390);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_390);
  Catch::AssertionHandler::complete((AssertionHandler *)local_3d8);
  if (local_39d == false) {
    (*local_398->_vptr_IResultCapture[0x13])();
  }
  local_390 = (undefined1  [8])0x1a94b4;
  local_388 = (pointer)0x23f;
  macroName_57.m_size = 5;
  macroName_57.m_start = "CHECK";
  capturedExpression_57.m_size = 0x1d;
  capturedExpression_57.m_start = "0 == data.isomericStates()[2]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_3d8,macroName_57,(SourceLineInfo *)local_390,
             capturedExpression_57,ContinueOnFailure);
  local_308._8_8_ = CONCAT44(local_328._12_4_,local_328._8_4_);
  local_2f8 = (double *)(local_328._0_8_ + 8);
  local_2f0 = (WithinRelMatcher *)0x4;
  lVar4 = (local_308._8_8_ - (long)local_2f8 >> 3) % 4;
  local_2e8 = 4 - lVar4;
  if (lVar4 == 0) {
    local_2e8 = 0;
  }
  local_1e0._M_current = local_2f8;
  local_1d8 = &local_308;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_1d8,&local_1e0,2);
  _local_370 = *local_1e0._M_current;
  local_388._1_1_ = (double)_local_370 == 0.0;
  local_388._0_1_ = true;
  local_390 = (undefined1  [8])&PTR_streamReconstructedExpression_001eb3e0;
  local_388 = local_388 & 0xffffffff;
  local_380 = (ITransientExpression *)0x1ab5ad;
  local_378 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_3d8,(ITransientExpression *)local_390);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_390);
  Catch::AssertionHandler::complete((AssertionHandler *)local_3d8);
  if (local_39d == false) {
    (*local_398->_vptr_IResultCapture[0x13])();
  }
  local_390 = (undefined1  [8])0x1a94b4;
  local_388 = (pointer)0x240;
  macroName_58.m_size = 5;
  macroName_58.m_start = "CHECK";
  capturedExpression_58.m_size = 0x17;
  capturedExpression_58.m_start = "2 == data.Y()[0].size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_3d8,macroName_58,(SourceLineInfo *)local_390,
             capturedExpression_58,ContinueOnFailure);
  _local_370 = (CONCAT44(local_328._12_4_,local_328._8_4_) - local_328._0_8_) + -0x10 >> 3;
  bVar3 = 1 < (ulong)_local_370;
  if (bVar3) {
    _local_370 = 2;
  }
  local_388._1_1_ = bVar3;
  local_388._0_1_ = true;
  local_390 = (undefined1  [8])&PTR_streamReconstructedExpression_001eb320;
  local_388._4_4_ = 2;
  local_380 = (ITransientExpression *)0x1ab5ad;
  local_378 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_3d8,(ITransientExpression *)local_390);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_390);
  Catch::AssertionHandler::complete((AssertionHandler *)local_3d8);
  if (local_39d == false) {
    (*local_398->_vptr_IResultCapture[0x13])();
  }
  local_390 = (undefined1  [8])0x1a94b4;
  local_388 = (pointer)0x241;
  macroName_59.m_size = 5;
  macroName_59.m_start = "CHECK";
  capturedExpression_59.m_size = 0x17;
  capturedExpression_59.m_start = "2 == data.Y()[1].size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_3d8,macroName_59,(SourceLineInfo *)local_390,
             capturedExpression_59,ContinueOnFailure);
  local_1c0.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.end_._M_current = (double *)CONCAT44(local_328._12_4_,local_328._8_4_);
  local_378 = (undefined1  [8])(local_328._0_8_ + 0x10);
  _local_370 = 2;
  local_368 = 9.88131291682493e-324;
  local_1c0.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value = 0;
  local_1c0.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.n_ = 2;
  lVar4 = (long)(((ulong)((long)local_1c0.
                                super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                                .
                                super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
                                .
                                super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                                .
                                super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
                                .
                                super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
                                .value.
                                super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
                                .data_.
                                super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
                                .value.end_._M_current - (long)local_378 >> 3) >> 1) +
                (ulong)(((uint)((long)local_1c0.
                                      super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                                      .
                                      super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
                                      .
                                      super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                                      .
                                      super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
                                      .
                                      super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
                                      .value.
                                      super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
                                      .data_.
                                      super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
                                      .value.end_._M_current - (long)local_378) >> 3 & 1) != 0)) % 2
  ;
  local_360 = (double)(2 - lVar4);
  if (lVar4 == 0) {
    local_360 = 0.0;
  }
  local_1c0.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)local_378;
  local_1a0 = (SourceLineInfo *)local_390;
  ranges::
  stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_1a0,&local_1c0,1);
  local_2e8 = (long)local_1c0.
                    super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                    .
                    super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
                    .
                    super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                    .
                    super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
                    .
                    super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
                    .value.
                    super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
                    .data_.
                    super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
                    .value.end_._M_current -
              (long)local_1c0.
                    super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                    .
                    super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
                    .
                    super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                    .
                    super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
                    .
                    super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
                    .value.
                    super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
                    .data_.
                    super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
                    .value._M_current >> 3;
  if ((ulong)local_1c0.
             super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
             .
             super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
             .
             super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
             .
             super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
             .
             super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
             .value.
             super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
             .data_.
             super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
             .value.n_ < local_2e8) {
    local_2e8 = local_1c0.
                super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                .
                super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
                .
                super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                .
                super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
                .
                super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
                .value.
                super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
                .data_.
                super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
                .value.n_;
  }
  local_308.m_result = local_2e8 == 2;
  local_308.m_isBinaryExpression = true;
  local_308._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001eb320;
  local_308._12_4_ = 2;
  local_2f8 = (double *)0x1ab5ad;
  local_2f0 = (WithinRelMatcher *)0x2;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_3d8,&local_308);
  Catch::ITransientExpression::~ITransientExpression(&local_308);
  Catch::AssertionHandler::complete((AssertionHandler *)local_3d8);
  if (local_39d == false) {
    (*local_398->_vptr_IResultCapture[0x13])();
  }
  local_390 = (undefined1  [8])0x1a94b4;
  local_388 = (pointer)0x242;
  macroName_60.m_size = 5;
  macroName_60.m_start = "CHECK";
  capturedExpression_60.m_size = 0x17;
  capturedExpression_60.m_start = "2 == data.Y()[2].size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_3d8,macroName_60,(SourceLineInfo *)local_390,
             capturedExpression_60,ContinueOnFailure);
  local_198.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.end_._M_current = (double *)CONCAT44(local_328._12_4_,local_328._8_4_);
  local_378 = (undefined1  [8])(local_328._0_8_ + 0x10);
  _local_370 = 2;
  local_368 = 9.88131291682493e-324;
  local_198.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value = 0;
  local_198.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.n_ = 2;
  lVar4 = (long)(((ulong)((long)local_198.
                                super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                                .
                                super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
                                .
                                super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                                .
                                super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
                                .
                                super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
                                .value.
                                super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
                                .data_.
                                super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
                                .value.end_._M_current - (long)local_378 >> 3) >> 1) +
                (ulong)(((uint)((long)local_198.
                                      super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                                      .
                                      super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
                                      .
                                      super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                                      .
                                      super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
                                      .
                                      super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
                                      .value.
                                      super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
                                      .data_.
                                      super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
                                      .value.end_._M_current - (long)local_378) >> 3 & 1) != 0)) % 2
  ;
  local_360 = (double)(2 - lVar4);
  if (lVar4 == 0) {
    local_360 = 0.0;
  }
  local_198.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)local_378;
  local_178 = (SourceLineInfo *)local_390;
  ranges::
  stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_178,&local_198,2);
  local_2e8 = (long)local_198.
                    super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                    .
                    super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
                    .
                    super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                    .
                    super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
                    .
                    super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
                    .value.
                    super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
                    .data_.
                    super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
                    .value.end_._M_current -
              (long)local_198.
                    super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                    .
                    super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
                    .
                    super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                    .
                    super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
                    .
                    super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
                    .value.
                    super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
                    .data_.
                    super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
                    .value._M_current >> 3;
  if ((ulong)local_198.
             super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
             .
             super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
             .
             super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
             .
             super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
             .
             super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
             .value.
             super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
             .data_.
             super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
             .value.n_ < local_2e8) {
    local_2e8 = local_198.
                super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                .
                super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
                .
                super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                .
                super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
                .
                super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
                .value.
                super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
                .data_.
                super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
                .value.n_;
  }
  local_308.m_result = local_2e8 == 2;
  local_308.m_isBinaryExpression = true;
  local_308._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001eb320;
  local_308._12_4_ = 2;
  local_2f8 = (double *)0x1ab5ad;
  local_2f0 = (WithinRelMatcher *)0x2;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_3d8,&local_308);
  Catch::ITransientExpression::~ITransientExpression(&local_308);
  Catch::AssertionHandler::complete((AssertionHandler *)local_3d8);
  if (local_39d == false) {
    (*local_398->_vptr_IResultCapture[0x13])();
  }
  local_390 = (undefined1  [8])0x1a94b4;
  local_388 = (pointer)0x243;
  macroName_61.m_size = 5;
  macroName_61.m_start = "CHECK";
  capturedExpression_61.m_size = 0x23;
  capturedExpression_61.m_start = "2 == data.fissionYields()[0].size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_3d8,macroName_61,(SourceLineInfo *)local_390,
             capturedExpression_61,ContinueOnFailure);
  _local_370 = (CONCAT44(local_328._12_4_,local_328._8_4_) - local_328._0_8_) + -0x10 >> 3;
  bVar3 = 1 < (ulong)_local_370;
  if (bVar3) {
    _local_370 = 2;
  }
  local_388._1_1_ = bVar3;
  local_388._0_1_ = true;
  local_390 = (undefined1  [8])&PTR_streamReconstructedExpression_001eb320;
  local_388._4_4_ = 2;
  local_380 = (ITransientExpression *)0x1ab5ad;
  local_378 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_3d8,(ITransientExpression *)local_390);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_390);
  Catch::AssertionHandler::complete((AssertionHandler *)local_3d8);
  if (local_39d == false) {
    (*local_398->_vptr_IResultCapture[0x13])();
  }
  local_390 = (undefined1  [8])0x1a94b4;
  local_388 = (pointer)0x244;
  macroName_62.m_size = 5;
  macroName_62.m_start = "CHECK";
  capturedExpression_62.m_size = 0x23;
  capturedExpression_62.m_start = "2 == data.fissionYields()[1].size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_3d8,macroName_62,(SourceLineInfo *)local_390,
             capturedExpression_62,ContinueOnFailure);
  local_170.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.end_._M_current = (double *)CONCAT44(local_328._12_4_,local_328._8_4_);
  local_378 = (undefined1  [8])(local_328._0_8_ + 0x10);
  _local_370 = 2;
  local_368 = 9.88131291682493e-324;
  local_170.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value = 0;
  local_170.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.n_ = 2;
  lVar4 = (long)(((ulong)((long)local_170.
                                super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                                .
                                super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
                                .
                                super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                                .
                                super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
                                .
                                super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
                                .value.
                                super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
                                .data_.
                                super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
                                .value.end_._M_current - (long)local_378 >> 3) >> 1) +
                (ulong)(((uint)((long)local_170.
                                      super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                                      .
                                      super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
                                      .
                                      super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                                      .
                                      super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
                                      .
                                      super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
                                      .value.
                                      super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
                                      .data_.
                                      super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
                                      .value.end_._M_current - (long)local_378) >> 3 & 1) != 0)) % 2
  ;
  local_360 = (double)(2 - lVar4);
  if (lVar4 == 0) {
    local_360 = 0.0;
  }
  local_170.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)local_378;
  local_150 = (SourceLineInfo *)local_390;
  ranges::
  stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_150,&local_170,1);
  local_2e8 = (long)local_170.
                    super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                    .
                    super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
                    .
                    super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                    .
                    super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
                    .
                    super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
                    .value.
                    super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
                    .data_.
                    super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
                    .value.end_._M_current -
              (long)local_170.
                    super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                    .
                    super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
                    .
                    super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                    .
                    super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
                    .
                    super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
                    .value.
                    super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
                    .data_.
                    super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
                    .value._M_current >> 3;
  if ((ulong)local_170.
             super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
             .
             super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
             .
             super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
             .
             super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
             .
             super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
             .value.
             super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
             .data_.
             super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
             .value.n_ < local_2e8) {
    local_2e8 = local_170.
                super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                .
                super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
                .
                super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                .
                super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
                .
                super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
                .value.
                super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
                .data_.
                super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
                .value.n_;
  }
  local_308.m_result = local_2e8 == 2;
  local_308.m_isBinaryExpression = true;
  local_308._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001eb320;
  local_308._12_4_ = 2;
  local_2f8 = (double *)0x1ab5ad;
  local_2f0 = (WithinRelMatcher *)0x2;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_3d8,&local_308);
  Catch::ITransientExpression::~ITransientExpression(&local_308);
  Catch::AssertionHandler::complete((AssertionHandler *)local_3d8);
  if (local_39d == false) {
    (*local_398->_vptr_IResultCapture[0x13])();
  }
  local_390 = (undefined1  [8])0x1a94b4;
  local_388 = (pointer)0x245;
  macroName_63.m_size = 5;
  macroName_63.m_start = "CHECK";
  capturedExpression_63.m_size = 0x23;
  capturedExpression_63.m_start = "2 == data.fissionYields()[2].size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_3d8,macroName_63,(SourceLineInfo *)local_390,
             capturedExpression_63,ContinueOnFailure);
  local_148.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.end_._M_current = (double *)CONCAT44(local_328._12_4_,local_328._8_4_);
  local_378 = (undefined1  [8])(local_328._0_8_ + 0x10);
  _local_370 = 2;
  local_368 = 9.88131291682493e-324;
  local_148.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value = 0;
  local_148.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.n_ = 2;
  lVar4 = (long)(((ulong)((long)local_148.
                                super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                                .
                                super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
                                .
                                super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                                .
                                super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
                                .
                                super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
                                .value.
                                super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
                                .data_.
                                super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
                                .value.end_._M_current - (long)local_378 >> 3) >> 1) +
                (ulong)(((uint)((long)local_148.
                                      super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                                      .
                                      super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
                                      .
                                      super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                                      .
                                      super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
                                      .
                                      super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
                                      .value.
                                      super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
                                      .data_.
                                      super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
                                      .value.end_._M_current - (long)local_378) >> 3 & 1) != 0)) % 2
  ;
  local_360 = (double)(2 - lVar4);
  if (lVar4 == 0) {
    local_360 = 0.0;
  }
  local_148.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)local_378;
  local_128 = (SourceLineInfo *)local_390;
  ranges::
  stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_128,&local_148,2);
  local_2e8 = (long)local_148.
                    super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                    .
                    super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
                    .
                    super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                    .
                    super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
                    .
                    super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
                    .value.
                    super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
                    .data_.
                    super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
                    .value.end_._M_current -
              (long)local_148.
                    super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                    .
                    super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
                    .
                    super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                    .
                    super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
                    .
                    super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
                    .value.
                    super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
                    .data_.
                    super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
                    .value._M_current >> 3;
  if ((ulong)local_148.
             super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
             .
             super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
             .
             super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
             .
             super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
             .
             super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
             .value.
             super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
             .data_.
             super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
             .value.n_ < local_2e8) {
    local_2e8 = local_148.
                super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                .
                super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
                .
                super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                .
                super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
                .
                super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
                .value.
                super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
                .data_.
                super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
                .value.n_;
  }
  local_308.m_result = local_2e8 == 2;
  local_308.m_isBinaryExpression = true;
  local_308._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001eb320;
  local_308._12_4_ = 2;
  local_2f8 = (double *)0x1ab5ad;
  local_2f0 = (WithinRelMatcher *)0x2;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_3d8,&local_308);
  Catch::ITransientExpression::~ITransientExpression(&local_308);
  Catch::AssertionHandler::complete((AssertionHandler *)local_3d8);
  if (local_39d == false) {
    (*local_398->_vptr_IResultCapture[0x13])();
  }
  local_390 = (undefined1  [8])0x1a94b4;
  local_388 = (pointer)0x246;
  macroName_64.m_size = 10;
  macroName_64.m_start = "CHECK_THAT";
  capturedExpression_64.m_size = 0x28;
  capturedExpression_64.m_start = "2.05032e-19, WithinRel( data.Y()[0][0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_3d8,macroName_64,(SourceLineInfo *)local_390,
             capturedExpression_64,ContinueOnFailure);
  local_2c8 = (undefined1  [8])0x3c0e41e3d444ff46;
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_390,*(double *)(local_328._0_8_ + 0x10));
  bVar3 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_390,(double *)local_2c8);
  local_308.m_result = bVar3;
  local_308.m_isBinaryExpression = true;
  local_308._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001eb260;
  local_2f8 = (double *)local_2c8;
  local_2f0 = (WithinRelMatcher *)local_390;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_3d8,&local_308);
  Catch::ITransientExpression::~ITransientExpression(&local_308);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_390);
  Catch::AssertionHandler::complete((AssertionHandler *)local_3d8);
  if (local_39d == false) {
    (*local_398->_vptr_IResultCapture[0x13])();
  }
  local_390 = (undefined1  [8])0x1a94b4;
  local_388 = (pointer)0x247;
  macroName_65.m_size = 10;
  macroName_65.m_start = "CHECK_THAT";
  capturedExpression_65.m_size = 0x28;
  capturedExpression_65.m_start = "1.31220e-19, WithinRel( data.Y()[0][1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_3d8,macroName_65,(SourceLineInfo *)local_390,
             capturedExpression_65,ContinueOnFailure);
  local_2c8 = (undefined1  [8])0x3c035d59f7e8f961;
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_390,*(double *)(local_328._0_8_ + 0x18));
  bVar3 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_390,(double *)local_2c8);
  local_308.m_result = bVar3;
  local_308.m_isBinaryExpression = true;
  local_308._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001eb260;
  local_2f8 = (double *)local_2c8;
  local_2f0 = (WithinRelMatcher *)local_390;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_3d8,&local_308);
  Catch::ITransientExpression::~ITransientExpression(&local_308);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_390);
  Catch::AssertionHandler::complete((AssertionHandler *)local_3d8);
  if (local_39d == false) {
    (*local_398->_vptr_IResultCapture[0x13])();
  }
  local_390 = (undefined1  [8])0x1a94b4;
  local_388 = (pointer)0x248;
  macroName_66.m_size = 10;
  macroName_66.m_start = "CHECK_THAT";
  capturedExpression_66.m_size = 0x28;
  capturedExpression_66.m_start = "7.851250e-4, WithinRel( data.Y()[1][0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_3d8,macroName_66,(SourceLineInfo *)local_390,
             capturedExpression_66,ContinueOnFailure);
  local_298.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x3f49ba1b1960fa16;
  local_2f0 = (WithinRelMatcher *)(local_328._0_8_ + 0x10);
  local_2e8 = 2;
  local_2e0 = 2;
  local_d0.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value = 0;
  local_d0.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.n_ = 2;
  lVar4 = CONCAT44(local_328._12_4_,local_328._8_4_) - (long)local_2f0;
  lVar4 = (long)(((ulong)(lVar4 >> 3) >> 1) + (ulong)(((uint)lVar4 >> 3 & 1) != 0)) % 2;
  local_2d8 = 2 - lVar4;
  if (lVar4 == 0) {
    local_2d8 = 0;
  }
  local_d0.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)local_2f0;
  local_b0 = &local_308;
  ranges::
  stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_b0,&local_d0,1);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_390,
             *(double *)
              local_d0.
              super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
              .
              super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
              .
              super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
              .
              super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
              .
              super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
              .value.
              super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
              .data_.
              super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
              .value._M_current);
  bVar3 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_390,(double *)&local_298);
  local_2c0._1_1_ = bVar3;
  local_2c0._0_1_ = true;
  local_2c8 = (undefined1  [8])&PTR_streamReconstructedExpression_001eb260;
  local_2b8 = (ITransientExpression *)&local_298;
  local_2b0._M_current = (double *)local_390;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_3d8,(ITransientExpression *)local_2c8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_2c8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_390);
  Catch::AssertionHandler::complete((AssertionHandler *)local_3d8);
  if (local_39d == false) {
    (*local_398->_vptr_IResultCapture[0x13])();
  }
  local_390 = (undefined1  [8])0x1a94b4;
  local_388 = (pointer)0x249;
  macroName_67.m_size = 10;
  macroName_67.m_start = "CHECK_THAT";
  capturedExpression_67.m_size = 0x28;
  capturedExpression_67.m_start = "4.710750e-5, WithinRel( data.Y()[1][1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_3d8,macroName_67,(SourceLineInfo *)local_390,
             capturedExpression_67,ContinueOnFailure);
  local_298.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x3f08b2a9600b2d86;
  local_2f0 = (WithinRelMatcher *)(local_328._0_8_ + 0x10);
  local_2e8 = 2;
  local_2e0 = 2;
  local_a8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value = 0;
  local_a8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.n_ = 2;
  lVar4 = CONCAT44(local_328._12_4_,local_328._8_4_) - (long)local_2f0;
  lVar4 = (long)(((ulong)(lVar4 >> 3) >> 1) + (ulong)(((uint)lVar4 >> 3 & 1) != 0)) % 2;
  local_2d8 = 2 - lVar4;
  if (lVar4 == 0) {
    local_2d8 = 0;
  }
  local_a8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)local_2f0;
  local_88 = &local_308;
  ranges::
  stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_88,&local_a8,1);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_390,
             *(double *)
              ((long)local_a8.
                     super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                     .
                     super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
                     .
                     super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                     .
                     super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
                     .
                     super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
                     .value.
                     super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
                     .data_.
                     super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
                     .value._M_current + 8));
  bVar3 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_390,(double *)&local_298);
  local_2c0._1_1_ = bVar3;
  local_2c0._0_1_ = true;
  local_2c8 = (undefined1  [8])&PTR_streamReconstructedExpression_001eb260;
  local_2b8 = (ITransientExpression *)&local_298;
  local_2b0._M_current = (double *)local_390;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_3d8,(ITransientExpression *)local_2c8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_2c8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_390);
  Catch::AssertionHandler::complete((AssertionHandler *)local_3d8);
  if (local_39d == false) {
    (*local_398->_vptr_IResultCapture[0x13])();
  }
  local_390 = (undefined1  [8])0x1a94b4;
  local_388 = (pointer)0x24a;
  macroName_68.m_size = 10;
  macroName_68.m_start = "CHECK_THAT";
  capturedExpression_68.m_size = 0x1e;
  capturedExpression_68.m_start = "0, WithinRel( data.Y()[2][0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_3d8,macroName_68,(SourceLineInfo *)local_390,
             capturedExpression_68,ContinueOnFailure);
  local_298.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       ((ulong)local_298.
               super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
               .
               super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
               .
               super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
               .value.
               super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
               .data_.
               super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
               .value._M_current & 0xffffffff00000000);
  local_2f0 = (WithinRelMatcher *)(local_328._0_8_ + 0x10);
  local_2e8 = 2;
  local_2e0 = 2;
  local_120.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value = 0;
  local_120.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.n_ = 2;
  lVar4 = CONCAT44(local_328._12_4_,local_328._8_4_) - (long)local_2f0;
  lVar4 = (long)(((ulong)(lVar4 >> 3) >> 1) + (ulong)(((uint)lVar4 >> 3 & 1) != 0)) % 2;
  local_2d8 = 2 - lVar4;
  if (lVar4 == 0) {
    local_2d8 = 0;
  }
  local_120.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)local_2f0;
  local_100 = &local_308;
  ranges::
  stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_100,&local_120,2);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_390,
             *(double *)
              local_120.
              super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
              .
              super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
              .
              super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
              .
              super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
              .
              super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
              .value.
              super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
              .data_.
              super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
              .value._M_current);
  local_120.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double)(int)local_298.
                    super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                    .
                    super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
                    .
                    super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                    .
                    super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
                    .
                    super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
                    .value.
                    super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
                    .data_.
                    super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
                    .value._M_current;
  bVar3 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_390,(double *)&local_120);
  local_2c0._1_1_ = bVar3;
  local_2c0._0_1_ = true;
  local_2c8 = (undefined1  [8])&PTR_streamReconstructedExpression_001eb3a0;
  local_2b8 = (ITransientExpression *)&local_298;
  local_2b0._M_current = (double *)local_390;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_3d8,(ITransientExpression *)local_2c8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_2c8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_390);
  Catch::AssertionHandler::complete((AssertionHandler *)local_3d8);
  if (local_39d == false) {
    (*local_398->_vptr_IResultCapture[0x13])();
  }
  local_390 = (undefined1  [8])0x1a94b4;
  local_388 = (pointer)0x24b;
  macroName_69.m_size = 10;
  macroName_69.m_start = "CHECK_THAT";
  capturedExpression_69.m_size = 0x1e;
  capturedExpression_69.m_start = "0, WithinRel( data.Y()[2][1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_3d8,macroName_69,(SourceLineInfo *)local_390,
             capturedExpression_69,ContinueOnFailure);
  local_298.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       ((ulong)local_298.
               super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
               .
               super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
               .
               super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
               .value.
               super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
               .data_.
               super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
               .value._M_current & 0xffffffff00000000);
  local_2f0 = (WithinRelMatcher *)(local_328._0_8_ + 0x10);
  local_2e8 = 2;
  local_2e0 = 2;
  local_f8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value = 0;
  local_f8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.n_ = 2;
  lVar4 = CONCAT44(local_328._12_4_,local_328._8_4_) - (long)local_2f0;
  lVar4 = (long)(((ulong)(lVar4 >> 3) >> 1) + (ulong)(((uint)lVar4 >> 3 & 1) != 0)) % 2;
  local_2d8 = 2 - lVar4;
  if (lVar4 == 0) {
    local_2d8 = 0;
  }
  local_f8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)local_2f0;
  local_d8 = &local_308;
  ranges::
  stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_d8,&local_f8,2);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_390,
             *(double *)
              ((long)local_f8.
                     super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                     .
                     super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
                     .
                     super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                     .
                     super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
                     .
                     super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
                     .value.
                     super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
                     .data_.
                     super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
                     .value._M_current + 8));
  local_f8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double)(int)local_298.
                    super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                    .
                    super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
                    .
                    super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                    .
                    super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
                    .
                    super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
                    .value.
                    super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
                    .data_.
                    super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
                    .value._M_current;
  bVar3 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_390,(double *)&local_f8);
  local_2c0._1_1_ = bVar3;
  local_2c0._0_1_ = true;
  local_2c8 = (undefined1  [8])&PTR_streamReconstructedExpression_001eb3a0;
  local_2b8 = (ITransientExpression *)&local_298;
  local_2b0._M_current = (double *)local_390;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_3d8,(ITransientExpression *)local_2c8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_2c8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_390);
  Catch::AssertionHandler::complete((AssertionHandler *)local_3d8);
  if (local_39d == false) {
    (*local_398->_vptr_IResultCapture[0x13])();
  }
  local_390 = (undefined1  [8])0x1a94b4;
  local_388 = (pointer)0x24c;
  macroName_70.m_size = 10;
  macroName_70.m_start = "CHECK_THAT";
  capturedExpression_70.m_size = 0x34;
  capturedExpression_70.m_start = "2.05032e-19, WithinRel( data.fissionYields()[0][0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_3d8,macroName_70,(SourceLineInfo *)local_390,
             capturedExpression_70,ContinueOnFailure);
  local_2c8 = (undefined1  [8])0x3c0e41e3d444ff46;
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_390,*(double *)(local_328._0_8_ + 0x10));
  bVar3 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_390,(double *)local_2c8);
  local_308.m_result = bVar3;
  local_308.m_isBinaryExpression = true;
  local_308._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001eb260;
  local_2f8 = (double *)local_2c8;
  local_2f0 = (WithinRelMatcher *)local_390;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_3d8,&local_308);
  Catch::ITransientExpression::~ITransientExpression(&local_308);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_390);
  Catch::AssertionHandler::complete((AssertionHandler *)local_3d8);
  if (local_39d == false) {
    (*local_398->_vptr_IResultCapture[0x13])();
  }
  local_390 = (undefined1  [8])0x1a94b4;
  local_388 = (pointer)0x24d;
  macroName_71.m_size = 10;
  macroName_71.m_start = "CHECK_THAT";
  capturedExpression_71.m_size = 0x34;
  capturedExpression_71.m_start = "1.31220e-19, WithinRel( data.fissionYields()[0][1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_3d8,macroName_71,(SourceLineInfo *)local_390,
             capturedExpression_71,ContinueOnFailure);
  local_2c8 = (undefined1  [8])0x3c035d59f7e8f961;
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_390,*(double *)(local_328._0_8_ + 0x18));
  bVar3 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_390,(double *)local_2c8);
  local_308.m_result = bVar3;
  local_308.m_isBinaryExpression = true;
  local_308._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001eb260;
  local_2f8 = (double *)local_2c8;
  local_2f0 = (WithinRelMatcher *)local_390;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_3d8,&local_308);
  Catch::ITransientExpression::~ITransientExpression(&local_308);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_390);
  Catch::AssertionHandler::complete((AssertionHandler *)local_3d8);
  if (local_39d == false) {
    (*local_398->_vptr_IResultCapture[0x13])();
  }
  local_390 = (undefined1  [8])0x1a94b4;
  local_388 = (pointer)0x24e;
  macroName_72.m_size = 10;
  macroName_72.m_start = "CHECK_THAT";
  capturedExpression_72.m_size = 0x34;
  capturedExpression_72.m_start = "7.851250e-4, WithinRel( data.fissionYields()[1][0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_3d8,macroName_72,(SourceLineInfo *)local_390,
             capturedExpression_72,ContinueOnFailure);
  local_298.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x3f49ba1b1960fa16;
  local_2f0 = (WithinRelMatcher *)(local_328._0_8_ + 0x10);
  local_2e8 = 2;
  local_2e0 = 2;
  local_80.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value = 0;
  local_80.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.n_ = 2;
  lVar4 = CONCAT44(local_328._12_4_,local_328._8_4_) - (long)local_2f0;
  lVar4 = (long)(((ulong)(lVar4 >> 3) >> 1) + (ulong)(((uint)lVar4 >> 3 & 1) != 0)) % 2;
  local_2d8 = 2 - lVar4;
  if (lVar4 == 0) {
    local_2d8 = 0;
  }
  local_80.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)local_2f0;
  local_60 = &local_308;
  ranges::
  stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_60,&local_80,1);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_390,
             *(double *)
              local_80.
              super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
              .
              super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
              .
              super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
              .
              super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
              .
              super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
              .value.
              super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
              .data_.
              super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
              .value._M_current);
  bVar3 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_390,(double *)&local_298);
  local_2c0._1_1_ = bVar3;
  local_2c0._0_1_ = true;
  local_2c8 = (undefined1  [8])&PTR_streamReconstructedExpression_001eb260;
  local_2b8 = (ITransientExpression *)&local_298;
  local_2b0._M_current = (double *)local_390;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_3d8,(ITransientExpression *)local_2c8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_2c8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_390);
  Catch::AssertionHandler::complete((AssertionHandler *)local_3d8);
  if (local_39d == false) {
    (*local_398->_vptr_IResultCapture[0x13])();
  }
  local_390 = (undefined1  [8])0x1a94b4;
  local_388 = (pointer)0x24f;
  macroName_73.m_size = 10;
  macroName_73.m_start = "CHECK_THAT";
  capturedExpression_73.m_size = 0x34;
  capturedExpression_73.m_start = "4.710750e-5, WithinRel( data.fissionYields()[1][1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_3d8,macroName_73,(SourceLineInfo *)local_390,
             capturedExpression_73,ContinueOnFailure);
  local_298.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x3f08b2a9600b2d86;
  local_2f0 = (WithinRelMatcher *)(local_328._0_8_ + 0x10);
  local_2e8 = 2;
  local_2e0 = 2;
  local_58.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value = 0;
  local_58.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.n_ = 2;
  lVar4 = CONCAT44(local_328._12_4_,local_328._8_4_) - (long)local_2f0;
  lVar4 = (long)(((ulong)(lVar4 >> 3) >> 1) + (ulong)(((uint)lVar4 >> 3 & 1) != 0)) % 2;
  local_2d8 = 2 - lVar4;
  if (lVar4 == 0) {
    local_2d8 = 0;
  }
  local_58.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)local_2f0;
  local_38 = &local_308;
  ranges::
  stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_38,&local_58,1);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_390,
             *(double *)
              ((long)local_58.
                     super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                     .
                     super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
                     .
                     super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                     .
                     super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
                     .
                     super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
                     .value.
                     super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
                     .data_.
                     super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
                     .value._M_current + 8));
  bVar3 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_390,(double *)&local_298);
  local_2c0._1_1_ = bVar3;
  local_2c0._0_1_ = true;
  local_2c8 = (undefined1  [8])&PTR_streamReconstructedExpression_001eb260;
  local_2b8 = (ITransientExpression *)&local_298;
  local_2b0._M_current = (double *)local_390;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_3d8,(ITransientExpression *)local_2c8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_2c8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_390);
  Catch::AssertionHandler::complete((AssertionHandler *)local_3d8);
  if (local_39d == false) {
    (*local_398->_vptr_IResultCapture[0x13])();
  }
  local_390 = (undefined1  [8])0x1a94b4;
  local_388 = (pointer)0x250;
  macroName_74.m_size = 10;
  macroName_74.m_start = "CHECK_THAT";
  capturedExpression_74.m_size = 0x2a;
  capturedExpression_74.m_start = "0, WithinRel( data.fissionYields()[2][0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_3d8,macroName_74,(SourceLineInfo *)local_390,
             capturedExpression_74,ContinueOnFailure);
  local_270._vptr_ITransientExpression =
       (_func_int **)((ulong)local_270._vptr_ITransientExpression._4_4_ << 0x20);
  local_2f0 = (WithinRelMatcher *)(local_328._0_8_ + 0x10);
  local_2e8 = 2;
  local_2e0 = 2;
  local_298.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value = 0;
  local_298.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.n_ = 2;
  lVar4 = CONCAT44(local_328._12_4_,local_328._8_4_) - (long)local_2f0;
  lVar4 = (long)(((ulong)(lVar4 >> 3) >> 1) + (ulong)(((uint)lVar4 >> 3 & 1) != 0)) % 2;
  local_2d8 = 2 - lVar4;
  if (lVar4 == 0) {
    local_2d8 = 0;
  }
  local_298.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)local_2f0;
  local_278 = &local_308;
  ranges::
  stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_278,&local_298,2);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_390,
             *(double *)
              local_298.
              super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
              .
              super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
              .
              super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
              .
              super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
              .
              super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
              .value.
              super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
              .data_.
              super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
              .value._M_current);
  local_298.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double)(int)local_270._vptr_ITransientExpression;
  bVar3 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_390,(double *)&local_298);
  local_2c0._1_1_ = bVar3;
  local_2c0._0_1_ = true;
  local_2c8 = (undefined1  [8])&PTR_streamReconstructedExpression_001eb3a0;
  local_2b8 = &local_270;
  local_2b0._M_current = (double *)local_390;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_3d8,(ITransientExpression *)local_2c8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_2c8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_390);
  Catch::AssertionHandler::complete((AssertionHandler *)local_3d8);
  if (local_39d == false) {
    (*local_398->_vptr_IResultCapture[0x13])();
  }
  local_390 = (undefined1  [8])0x1a94b4;
  local_388 = (pointer)0x251;
  macroName_75.m_size = 10;
  macroName_75.m_start = "CHECK_THAT";
  capturedExpression_75.m_size = 0x2a;
  capturedExpression_75.m_start = "0, WithinRel( data.fissionYields()[2][1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_3d8,macroName_75,(SourceLineInfo *)local_390,
             capturedExpression_75,ContinueOnFailure);
  local_29c = 0;
  local_2f0 = (WithinRelMatcher *)(local_328._0_8_ + 0x10);
  local_2e8 = 2;
  local_2e0 = 2;
  local_2c0 = 0;
  local_2b8 = (ITransientExpression *)0x2;
  lVar4 = CONCAT44(local_328._12_4_,local_328._8_4_) - (long)local_2f0;
  lVar4 = (long)(((ulong)(lVar4 >> 3) >> 1) + (ulong)(((uint)lVar4 >> 3 & 1) != 0)) % 2;
  local_2d8 = 2 - lVar4;
  if (lVar4 == 0) {
    local_2d8 = 0;
  }
  local_2c8 = (undefined1  [8])local_2f0;
  local_2a8 = &local_308;
  ranges::
  stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_2a8,(iterator_t<CRng>_conflict3 *)local_2c8,2);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_390,(double)*(_func_int **)((long)local_2c8 + 8));
  local_2c8 = (undefined1  [8])(double)local_29c;
  local_270.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_390,(double *)local_2c8);
  local_270.m_isBinaryExpression = true;
  local_270._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001eb3a0;
  local_260 = &local_29c;
  local_258 = (WithinRelMatcher *)local_390;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_3d8,&local_270);
  Catch::ITransientExpression::~ITransientExpression(&local_270);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_390);
  Catch::AssertionHandler::complete((AssertionHandler *)local_3d8);
  if (local_39d == false) {
    (*local_398->_vptr_IResultCapture[0x13])();
  }
  local_390 = (undefined1  [8])0x1a94b4;
  local_388 = (pointer)0x253;
  macroName_76.m_size = 5;
  macroName_76.m_start = "CHECK";
  capturedExpression_76.m_size = 0xf;
  capturedExpression_76.m_start = "4 == chunk.NC()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_3d8,macroName_76,(SourceLineInfo *)local_390,
             capturedExpression_76,ContinueOnFailure);
  _local_370 = 1;
  for (pFVar7 = (local_2d0->data_).
                super__Vector_base<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pFVar7 != (local_2d0->data_).
                super__Vector_base<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
                ._M_impl.super__Vector_impl_data._M_finish; pFVar7 = pFVar7 + 1) {
    _local_370 = _local_370 +
                 (((long)(pFVar7->super_ListRecord).data.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(pFVar7->super_ListRecord).data.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3) + 5) / 6 + 1;
  }
  local_388._1_1_ = _local_370 == 4;
  local_388._0_1_ = true;
  local_390 = (undefined1  [8])&PTR_streamReconstructedExpression_001eb2e0;
  local_388._4_4_ = 4;
  local_380 = (ITransientExpression *)0x1ab5ad;
  local_378 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_3d8,(ITransientExpression *)local_390);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_390);
  Catch::AssertionHandler::complete((AssertionHandler *)local_3d8);
  if (local_39d == false) {
    (*local_398->_vptr_IResultCapture[0x13])();
  }
  if ((double *)local_328._0_8_ != (double *)0x0) {
    operator_delete((void *)local_328._0_8_,(long)local_318 - local_328._0_8_);
  }
  return;
}

Assistant:

void verifyChunkWithEnergyIndependentYields( const section::Type< 8, 454 >& chunk ) {

  CHECK( 454 == chunk.MT() );
  CHECK( 454 == chunk.sectionNumber() );

  CHECK( 92235 == chunk.ZA() );
  CHECK( 92235 == chunk.targetIdentifier() );
  CHECK_THAT( 233.0250, WithinRel( chunk.AWR() ) );
  CHECK_THAT( 233.0250, WithinRel( chunk.atomicWeightRatio() ) );

  CHECK( true == chunk.LE() );
  CHECK( true == chunk.isEnergyIndependent() );

  CHECK( 1 == chunk.NE() );
  CHECK( 1 == chunk.E().size() );
  CHECK( 1 == chunk.incidentEnergies().size() );
  CHECK_THAT( 0., WithinRel( chunk.E()[0] ) );
  CHECK_THAT( 0., WithinRel( chunk.incidentEnergies()[0] ) );

  CHECK( 1 == chunk.yields().size() );

  auto data = chunk.yields()[0];
  CHECK( 0 == data.I() );
  CHECK( 0 == data.interpolationType() );
  CHECK( true == data.LE() );
  CHECK( true == data.isEnergyIndependent() );
  CHECK( 3 == data.NFP() );
  CHECK( 3 == data.numberFissionProducts() );
  CHECK_THAT( 0., WithinRel( data.E() ) );
  CHECK_THAT( 0., WithinRel( data.incidentEnergy() ) );

  CHECK( 3 == data.fissionProducts().size() );
  CHECK( 23066 == data.fissionProducts()[0].ZAFP() );
  CHECK( 54135 == data.fissionProducts()[1].ZAFP() );
  CHECK( 72171 == data.fissionProducts()[2].ZAFP() );
  CHECK( 23066 == data.fissionProducts()[0].fissionProductIdentifier() );
  CHECK( 54135 == data.fissionProducts()[1].fissionProductIdentifier() );
  CHECK( 72171 == data.fissionProducts()[2].fissionProductIdentifier() );
  CHECK( 0 == data.fissionProducts()[0].FPS() );
  CHECK( 0 == data.fissionProducts()[1].FPS() );
  CHECK( 0 == data.fissionProducts()[2].FPS() );
  CHECK( 0 == data.fissionProducts()[0].isomericState() );
  CHECK( 0 == data.fissionProducts()[1].isomericState() );
  CHECK( 0 == data.fissionProducts()[2].isomericState() );
  CHECK_THAT( 2.05032e-19, WithinRel( data.fissionProducts()[0].Y()[0] ) );
  CHECK_THAT( 1.31220e-19, WithinRel( data.fissionProducts()[0].Y()[1] ) );
  CHECK_THAT( 7.851250e-4, WithinRel( data.fissionProducts()[1].Y()[0] ) );
  CHECK_THAT( 4.710750e-5, WithinRel( data.fissionProducts()[1].Y()[1] ) );
  CHECK_THAT( 0, WithinRel( data.fissionProducts()[2].Y()[0] ) );
  CHECK_THAT( 0, WithinRel( data.fissionProducts()[2].Y()[1] ) );

  CHECK( 3 == data.ZAFP().size() );
  CHECK( 3 == data.fissionProductIdentifiers().size() );
  CHECK( 3 == data.FPS().size() );
  CHECK( 3 == data.isomericStates().size() );
  CHECK( 3 == data.Y().size() );
  CHECK( 3 == data.fissionYields().size() );
  CHECK( 23066 == data.ZAFP()[0] );
  CHECK( 54135 == data.ZAFP()[1] );
  CHECK( 72171 == data.ZAFP()[2] );
  CHECK( 23066 == data.fissionProductIdentifiers()[0] );
  CHECK( 54135 == data.fissionProductIdentifiers()[1] );
  CHECK( 72171 == data.fissionProductIdentifiers()[2] );
  CHECK( 0 == data.FPS()[0] );
  CHECK( 0 == data.FPS()[1] );
  CHECK( 0 == data.FPS()[2] );
  CHECK( 0 == data.isomericStates()[0] );
  CHECK( 0 == data.isomericStates()[1] );
  CHECK( 0 == data.isomericStates()[2] );
  CHECK( 2 == data.Y()[0].size() );
  CHECK( 2 == data.Y()[1].size() );
  CHECK( 2 == data.Y()[2].size() );
  CHECK( 2 == data.fissionYields()[0].size() );
  CHECK( 2 == data.fissionYields()[1].size() );
  CHECK( 2 == data.fissionYields()[2].size() );
  CHECK_THAT( 2.05032e-19, WithinRel( data.Y()[0][0] ) );
  CHECK_THAT( 1.31220e-19, WithinRel( data.Y()[0][1] ) );
  CHECK_THAT( 7.851250e-4, WithinRel( data.Y()[1][0] ) );
  CHECK_THAT( 4.710750e-5, WithinRel( data.Y()[1][1] ) );
  CHECK_THAT( 0, WithinRel( data.Y()[2][0] ) );
  CHECK_THAT( 0, WithinRel( data.Y()[2][1] ) );
  CHECK_THAT( 2.05032e-19, WithinRel( data.fissionYields()[0][0] ) );
  CHECK_THAT( 1.31220e-19, WithinRel( data.fissionYields()[0][1] ) );
  CHECK_THAT( 7.851250e-4, WithinRel( data.fissionYields()[1][0] ) );
  CHECK_THAT( 4.710750e-5, WithinRel( data.fissionYields()[1][1] ) );
  CHECK_THAT( 0, WithinRel( data.fissionYields()[2][0] ) );
  CHECK_THAT( 0, WithinRel( data.fissionYields()[2][1] ) );

  CHECK( 4 == chunk.NC() );
}